

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void reuse_with_snapshot_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status extraout_EAX;
  fdb_status extraout_EAX_00;
  fdb_status extraout_EAX_01;
  size_t keylen;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  char cVar12;
  char *pcVar13;
  fdb_config *pfVar14;
  fdb_config *pfVar15;
  char *pcVar16;
  fdb_doc **doc;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  char *pcVar21;
  fdb_kvs_handle **ptr_handle;
  __atomic_base<unsigned_long> handle;
  uint uVar22;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  char *pcVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  size_t rvalue_len;
  void *rvalue;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [512];
  char bodybuf [512];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_30f0;
  fdb_file_handle *pfStackY_30e8;
  fdb_kvs_config fStackY_30e0;
  char acStackY_30c8 [264];
  fdb_config fStackY_2fc0;
  char acStackY_2ec8 [520];
  fdb_doc **ppfStackY_2cc0;
  size_t sStackY_2cb0;
  char *pcStackY_2ca8;
  char *pcStackY_2ca0;
  code *pcStackY_2c98;
  fdb_kvs_handle *pfStack_2c88;
  fdb_file_handle *pfStack_2c80;
  fdb_iterator *pfStack_2c78;
  fdb_doc *pfStack_2c70;
  fdb_kvs_handle *pfStack_2c68;
  timeval tStack_2c60;
  char acStack_2c50 [512];
  fdb_kvs_config fStack_2a50;
  fdb_file_info fStack_2a38;
  char acStack_29f0 [256];
  fdb_config fStack_28f0;
  char *pcStack_27f8;
  fdb_kvs_handle *pfStack_27f0;
  fdb_kvs_handle *pfStack_27e8;
  fdb_kvs_handle *pfStack_27e0;
  fdb_kvs_handle *pfStack_27d8;
  fdb_kvs_handle *pfStack_27d0;
  fdb_kvs_handle *pfStack_27c0;
  fdb_file_handle *pfStack_27b8;
  uint uStack_27ac;
  fdb_kvs_info fStack_27a8;
  timeval tStack_2778;
  fdb_kvs_config fStack_2768;
  undefined1 auStack_2750 [80];
  docio_handle *pdStack_2700;
  btreeblk_handle *pbStack_26f8;
  btree_blk_ops *pbStack_26f0;
  filemgr_ops *pfStack_26e8;
  fdb_config fStack_26e0;
  undefined1 uStack_2509;
  fdb_kvs_handle fStack_2508;
  fdb_kvs_handle *pfStack_2300;
  char *pcStack_22f8;
  char *pcStack_22f0;
  fdb_kvs_handle *pfStack_22e8;
  fdb_kvs_handle *pfStack_22e0;
  fdb_file_handle *pfStack_22d8;
  timeval tStack_22d0;
  undefined1 auStack_22c0 [536];
  undefined1 auStack_20a8 [375];
  undefined1 uStack_1f31;
  fdb_kvs_handle *pfStack_1ea8;
  undefined8 uStack_1e90;
  fdb_kvs_handle *pfStack_1e68;
  fdb_kvs_handle *pfStack_1e60;
  fdb_kvs_handle *pfStack_1e58;
  fdb_kvs_handle *pfStack_1e50;
  fdb_kvs_handle *pfStack_1e48;
  code *pcStack_1e40;
  fdb_kvs_handle *pfStack_1e38;
  fdb_file_handle *pfStack_1e30;
  fdb_kvs_handle *pfStack_1e28;
  fdb_kvs_handle *pfStack_1e20;
  fdb_kvs_config fStack_1e18;
  timeval tStack_1e00;
  fdb_file_info fStack_1df0;
  fdb_kvs_info fStack_1da8;
  undefined1 auStack_1d78 [512];
  fdb_kvs_handle fStack_1b78;
  size_t sStack_1970;
  char *pcStack_1968;
  char *pcStack_1960;
  code *pcStack_1958;
  fdb_kvs_handle *pfStack_1950;
  fdb_file_handle *pfStack_1948;
  fdb_kvs_info fStack_1940;
  timeval tStack_1910;
  fdb_kvs_config fStack_1900;
  fdb_file_info fStack_18e8;
  char acStack_18a0 [256];
  char acStack_17a0 [511];
  undefined1 uStack_15a1;
  fdb_config fStack_13a0;
  char *pcStack_12a8;
  fdb_config *pfStack_12a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1298;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1290;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1288;
  code *pcStack_1280;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1278;
  fdb_file_handle *pfStack_1270;
  size_t sStack_1268;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1260;
  kvs_info *pkStack_1258;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1250;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1248;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1240;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1238;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1230;
  timeval tStack_1228;
  undefined1 auStack_1218 [24];
  fdb_file_info fStack_1200;
  fdb_config fStack_11b8;
  fdb_config fStack_10b8;
  fdb_config *pfStack_fc0;
  fdb_kvs_handle *pfStack_fb8;
  fdb_kvs_handle *pfStack_fb0;
  fdb_config *pfStack_fa8;
  snap_handle *psStack_fa0;
  code *pcStack_f98;
  fdb_kvs_handle *pfStack_f90;
  fdb_file_handle *pfStack_f88;
  fdb_kvs_handle *pfStack_f80;
  fdb_config *pfStack_f78;
  size_t sStack_f70;
  fdb_kvs_config fStack_f68;
  timeval tStack_f50;
  undefined1 auStack_f40 [280];
  undefined8 uStack_e28;
  fdb_config *pfStack_e00;
  fdb_kvs_handle *pfStack_df8;
  fdb_config *pfStack_df0;
  snap_handle *psStack_de8;
  code *pcStack_de0;
  fdb_kvs_handle *pfStack_dd8;
  fdb_file_handle *pfStack_dd0;
  fdb_kvs_handle *pfStack_dc8;
  fdb_kvs_config fStack_dc0;
  undefined1 auStack_da8 [40];
  undefined1 auStack_d80 [119];
  uint8_t uStack_d09;
  undefined8 uStack_c68;
  ulong uStack_c40;
  fdb_kvs_handle *pfStack_c38;
  fdb_kvs_handle *pfStack_c30;
  fdb_config *pfStack_c28;
  snap_handle *psStack_c20;
  code *pcStack_c18;
  fdb_kvs_handle *pfStack_c10;
  fdb_file_handle *pfStack_c08;
  fdb_kvs_handle *pfStack_c00;
  fdb_config *pfStack_bf8;
  size_t sStack_bf0;
  fdb_kvs_config fStack_be8;
  timeval tStack_bd0;
  undefined1 auStack_bc0 [280];
  uint8_t auStack_aa8 [40];
  char acStack_a80 [264];
  fdb_kvs_handle *pfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_kvs_handle *pfStack_968;
  fdb_kvs_handle *pfStack_960;
  snap_handle *psStack_958;
  code *pcStack_950;
  fdb_kvs_handle *pfStack_948;
  fdb_file_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  void *pvStack_930;
  undefined1 auStack_928 [56];
  timeval tStack_8f0;
  undefined1 auStack_8e0 [119];
  undefined1 uStack_869;
  undefined8 uStack_7c8;
  fdb_config *pfStack_7a0;
  atomic<unsigned_long> aStack_798;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  snap_handle *psStack_780;
  code *pcStack_778;
  fdb_file_handle *pfStack_768;
  fdb_kvs_handle *pfStack_760;
  fdb_kvs_handle *pfStack_758;
  fdb_kvs_config fStack_750;
  timeval tStack_738;
  undefined1 auStack_728 [119];
  undefined1 uStack_6b1;
  undefined8 uStack_610;
  fdb_kvs_handle *pfStack_5e8;
  fdb_kvs_handle *pfStack_5e0;
  snap_handle *psStack_5d8;
  code *pcStack_5d0;
  fdb_kvs_handle *local_5c0;
  fdb_file_handle *local_5b8;
  fdb_kvs_handle *local_5b0;
  size_t local_5a8;
  fdb_kvs_handle *local_5a0;
  timeval local_598;
  fdb_kvs_config local_588;
  undefined1 local_570 [583];
  undefined1 local_329;
  undefined1 local_328 [559];
  undefined1 local_f9;
  undefined8 local_70;
  undefined8 local_58;
  
  pcStack_5d0 = (code *)0x10b59e;
  gettimeofday(&local_598,(__timezone_ptr_t)0x0);
  pcStack_5d0 = (code *)0x10b5a3;
  memleak_start();
  pcStack_5d0 = (code *)0x10b5b0;
  fdb_get_default_kvs_config();
  pcStack_5d0 = (code *)0x10b5c0;
  fdb_get_default_config();
  local_f9 = 0;
  local_70 = 0x41;
  local_58 = 10;
  pcStack_5d0 = (code *)0x10b5e7;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_5d0 = (code *)0x10b5fe;
  fdb_open(&local_5b8,"./staleblktest1",(fdb_config *)(local_328 + 0x200));
  pcStack_5d0 = (code *)0x10b60e;
  fdb_kvs_open_default(local_5b8,&local_5c0,&local_588);
  iVar4 = (int)local_58 * 2;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  pcVar21 = (char *)(ulong)(uint)-iVar4;
  pcVar13 = (char *)0x1;
  pcVar23 = local_570 + 0x48;
  handle._M_i = (__int_type)local_328;
  do {
    if (-iVar4 + (int)pcVar13 == 1) goto LAB_0010b6be;
    pcStack_5d0 = (code *)0x10b652;
    memset(pcVar23,0x6b,0x1ff);
    local_329 = 0;
    pcStack_5d0 = (code *)0x10b66d;
    sprintf((char *)handle._M_i,"orig_body%d",pcVar13);
    pfVar6 = local_5c0;
    pcStack_5d0 = (code *)0x10b67a;
    keylen = strlen(pcVar23);
    pcStack_5d0 = (code *)0x10b685;
    sVar5 = strlen((char *)handle._M_i);
    pcStack_5d0 = (code *)0x10b69a;
    fVar2 = fdb_set_kv(pfVar6,pcVar23,keylen,(void *)handle._M_i,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba07;
    pcStack_5d0 = (code *)0x10b6b1;
    fVar2 = fdb_commit(local_5b8,'\x01');
    pcVar13 = (char *)(ulong)((int)pcVar13 + 1);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_5d0 = (code *)0x10b6be;
  reuse_with_snapshot_test();
LAB_0010b6be:
  pcVar13 = local_570 + 0x48;
  keylen = 0;
  pcVar23 = local_328;
  pcVar21 = local_570;
  do {
    pcStack_5d0 = (code *)0x10b6e7;
    memset(pcVar13,0x72,0x1ff);
    local_329 = 0;
    pcStack_5d0 = (code *)0x10b701;
    memset(pcVar23,0x79,0x1ff);
    handle._M_i = (__int_type)local_5c0;
    local_328[0x1ff] = 0;
    pcStack_5d0 = (code *)0x10b716;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar13);
    pcStack_5d0 = (code *)0x10b721;
    sVar5 = strlen(pcVar23);
    pcStack_5d0 = (code *)0x10b736;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar13,(size_t)pfVar6,pcVar23,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010b9f9:
      pcStack_5d0 = (code *)0x10ba00;
      reuse_with_snapshot_test();
      goto LAB_0010ba00;
    }
    pcStack_5d0 = (code *)0x10b74b;
    fVar2 = fdb_get_file_info(local_5b8,(fdb_file_info *)pcVar21);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_5d0 = (code *)0x10b9f9;
      reuse_with_snapshot_test();
      goto LAB_0010b9f9;
    }
  } while ((ulong)local_570._40_8_ < 0x1000000);
  pcStack_5d0 = (code *)0x10b76f;
  sVar3 = sb_check_block_reusing(local_5c0);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010ba15;
  pcStack_5d0 = (code *)0x10b78c;
  fVar2 = fdb_snapshot_open(local_5c0,&local_5b0,8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba1a;
  pcStack_5d0 = (code *)0x10b7a3;
  fVar2 = fdb_commit(local_5b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba21;
  pcVar13 = "key%d";
  pcVar23 = local_570 + 0x48;
  pcVar21 = local_328;
  keylen = 0;
  do {
    pcStack_5d0 = (code *)0x10b7d3;
    sprintf(pcVar23,"key%d",keylen);
    pcStack_5d0 = (code *)0x10b7e5;
    memset(pcVar21,0x7a,0x1ff);
    handle._M_i = (__int_type)local_5c0;
    local_328[0x1ff] = 0;
    pcStack_5d0 = (code *)0x10b7fa;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar23);
    pcStack_5d0 = (code *)0x10b805;
    sVar5 = strlen(pcVar21);
    pcStack_5d0 = (code *)0x10b819;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar23,(size_t)pfVar6,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba00;
    pcStack_5d0 = (code *)0x10b82b;
    sVar3 = sb_check_block_reusing(local_5c0);
    keylen = (size_t)((int)keylen + 1);
  } while (sVar3 != SBD_NONE);
  keylen = (size_t)(uint)((int)local_58 * 2);
  if (0 < (int)local_58 * 2) {
    pcVar13 = local_570 + 0x48;
    do {
      pcStack_5d0 = (code *)0x10b858;
      memset(pcVar13,0x6b,0x1ff);
      pcVar23 = (char *)local_5c0;
      local_329 = 0;
      pcStack_5d0 = (code *)0x10b86d;
      sVar5 = strlen(pcVar13);
      pcStack_5d0 = (code *)0x10b87b;
      fVar2 = fdb_del_kv((fdb_kvs_handle *)pcVar23,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba0e;
      uVar17 = (int)keylen - 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 0);
  }
  pcStack_5d0 = (code *)0x10b896;
  fVar2 = fdb_commit(local_5b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba28;
  pcVar13 = local_570 + 0x48;
  pcStack_5d0 = (code *)0x10b8b8;
  memset(pcVar13,0x6b,0x1ff);
  local_329 = 0;
  pcStack_5d0 = (code *)0x10b8da;
  sprintf(local_328,"orig_body%d",8);
  pcVar23 = (char *)local_5c0;
  pcStack_5d0 = (code *)0x10b8e7;
  sVar5 = strlen(pcVar13);
  pcStack_5d0 = (code *)0x10b8ff;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar23,pcVar13,sVar5,&local_5a0,&local_5a8);
  pfVar11 = local_5b0;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010ba2f;
  pcVar23 = local_570 + 0x48;
  pcStack_5d0 = (code *)0x10b91d;
  sVar5 = strlen(pcVar23);
  pcStack_5d0 = (code *)0x10b935;
  fVar2 = fdb_get_kv(pfVar11,pcVar23,sVar5,&local_5a0,&local_5a8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba34;
  pcStack_5d0 = (code *)0x10b957;
  iVar4 = bcmp(local_5a0,local_328,local_5a8);
  pfVar11 = local_5a0;
  if (iVar4 != 0) goto LAB_0010ba3b;
  pcStack_5d0 = (code *)0x10b967;
  fVar2 = fdb_free_block(local_5a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba4b;
  pcStack_5d0 = (code *)0x10b979;
  fVar2 = fdb_kvs_close(local_5b0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba52;
  pcStack_5d0 = (code *)0x10b98b;
  fVar2 = fdb_kvs_close(local_5c0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba59;
  pcStack_5d0 = (code *)0x10b99d;
  fVar2 = fdb_close(local_5b8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_5d0 = (code *)0x10b9aa;
    fdb_shutdown();
    pcStack_5d0 = (code *)0x10b9af;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (reuse_with_snapshot_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pcStack_5d0 = (code *)0x10b9e0;
    fprintf(_stderr,pcVar21,"reuse with snapshot test");
    return;
  }
  goto LAB_0010ba60;
LAB_0010ba00:
  pcStack_5d0 = (code *)0x10ba07;
  reuse_with_snapshot_test();
LAB_0010ba07:
  pcStack_5d0 = (code *)0x10ba0e;
  reuse_with_snapshot_test();
LAB_0010ba0e:
  pcStack_5d0 = (code *)0x10ba15;
  reuse_with_snapshot_test();
LAB_0010ba15:
  pcStack_5d0 = (code *)0x10ba1a;
  reuse_with_snapshot_test();
LAB_0010ba1a:
  pcStack_5d0 = (code *)0x10ba21;
  reuse_with_snapshot_test();
LAB_0010ba21:
  pcStack_5d0 = (code *)0x10ba28;
  reuse_with_snapshot_test();
LAB_0010ba28:
  pcStack_5d0 = (code *)0x10ba2f;
  reuse_with_snapshot_test();
LAB_0010ba2f:
  pfVar11 = (fdb_kvs_handle *)pcVar13;
  pcStack_5d0 = (code *)0x10ba34;
  reuse_with_snapshot_test();
LAB_0010ba34:
  pcStack_5d0 = (code *)0x10ba3b;
  reuse_with_snapshot_test();
LAB_0010ba3b:
  pcStack_5d0 = (code *)0x10ba4b;
  reuse_with_snapshot_test();
LAB_0010ba4b:
  pcStack_5d0 = (code *)0x10ba52;
  reuse_with_snapshot_test();
LAB_0010ba52:
  pcStack_5d0 = (code *)0x10ba59;
  reuse_with_snapshot_test();
LAB_0010ba59:
  pcStack_5d0 = (code *)0x10ba60;
  reuse_with_snapshot_test();
LAB_0010ba60:
  pcStack_5d0 = verify_minimum_num_keeping_headers_param_test;
  reuse_with_snapshot_test();
  pcStack_778 = (code *)0x10ba79;
  pfStack_5e8 = pfVar11;
  pfStack_5e0 = (fdb_kvs_handle *)pcVar23;
  psStack_5d8 = (snap_handle *)pcVar21;
  pcStack_5d0 = (code *)keylen;
  memleak_start();
  pcStack_778 = (code *)0x10ba85;
  gettimeofday(&tStack_738,(__timezone_ptr_t)0x0);
  pfVar14 = (fdb_config *)(auStack_728 + 0x48);
  pcStack_778 = (code *)0x10ba95;
  fdb_get_default_config();
  pcStack_778 = (code *)0x10ba9f;
  fdb_get_default_kvs_config();
  pcStack_778 = (code *)0x10baab;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_6b1 = 0;
  uStack_610 = 0;
  pcStack_778 = (code *)0x10bace;
  fVar2 = fdb_open(&pfStack_768,"./staleblktest1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
LAB_0010bcc9:
    pcStack_778 = (code *)0x10bcce;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcce:
    pcStack_778 = (code *)0x10bcd5;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcd5:
    pcStack_778 = (code *)0x10bcdc;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcdc:
    pcStack_778 = (code *)0x10bce3;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bce3:
    pcStack_778 = (code *)0x10bcea;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcea:
    pcStack_778 = (code *)0x10bcf1;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcf1:
    pcStack_778 = (code *)0x10bcf6;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcf6:
    pcStack_778 = (code *)0x10bcfd;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcfd:
    pcStack_778 = (code *)0x10bd04;
    verify_minimum_num_keeping_headers_param_test();
  }
  else {
    uStack_610 = 1;
    pcStack_778 = (code *)0x10bafa;
    fVar2 = fdb_open(&pfStack_768,"./staleblktest1",(fdb_config *)(auStack_728 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcce;
    pcStack_778 = (code *)0x10bb1d;
    fVar2 = fdb_kvs_open(pfStack_768,&pfStack_760,"num_keep",&fStack_750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcd5;
    keylen = 10;
    pfVar14 = (fdb_config *)0x147599;
    pcVar23 = "val";
    do {
      pcStack_778 = (code *)0x10bb53;
      fVar2 = fdb_set_kv(pfStack_760,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bcb4:
        pcStack_778 = (code *)0x10bcbb;
        verify_minimum_num_keeping_headers_param_test();
        goto LAB_0010bcbb;
      }
      pcStack_778 = (code *)0x10bb6a;
      fVar2 = fdb_commit(pfStack_768,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_778 = (code *)0x10bcb4;
        verify_minimum_num_keeping_headers_param_test();
        goto LAB_0010bcb4;
      }
      uVar17 = (int)keylen - 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_778 = (code *)0x10bb8a;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcdc;
    pfVar14 = (fdb_config *)0x147599;
    pcVar23 = "val";
    pcVar21 = auStack_728;
    do {
      pcStack_778 = (code *)0x10bbc0;
      fVar2 = fdb_set_kv(pfStack_760,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcc2;
      pcStack_778 = (code *)0x10bbd5;
      fVar2 = fdb_get_file_info(pfStack_768,(fdb_file_info *)pcVar21);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcbb;
    } while ((ulong)auStack_728._40_8_ < 0x1000001);
    pcStack_778 = (code *)0x10bbf2;
    fVar2 = fdb_kvs_close(pfStack_758);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bce3;
    pcStack_778 = (code *)0x10bc09;
    fVar2 = fdb_commit(pfStack_768,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcea;
    pcStack_778 = (code *)0x10bc25;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,9);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010bcf1;
    pcStack_778 = (code *)0x10bc42;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcf6;
    pcStack_778 = (code *)0x10bc54;
    fVar2 = fdb_close(pfStack_768);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcfd;
    pcStack_778 = (code *)0x10bc61;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_778 = (code *)0x10bc6e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (verify_minimum_num_keeping_headers_param_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_778 = (code *)0x10bc9f;
      fprintf(_stderr,pcVar21,"verify minimum num keeping headers param test");
      return;
    }
  }
  pcStack_778 = verify_high_num_keeping_headers_param_test;
  verify_minimum_num_keeping_headers_param_test();
  pcStack_950 = (code *)0x10bd21;
  pfStack_7a0 = pfVar14;
  aStack_798.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  pfStack_790 = pfVar6;
  pfStack_788 = (fdb_kvs_handle *)pcVar23;
  psStack_780 = (snap_handle *)pcVar21;
  pcStack_778 = (code *)keylen;
  memleak_start();
  pcStack_950 = (code *)0x10bd2d;
  gettimeofday(&tStack_8f0,(__timezone_ptr_t)0x0);
  pcVar13 = auStack_8e0 + 0x48;
  pcStack_950 = (code *)0x10bd3d;
  fdb_get_default_config();
  pcStack_950 = (code *)0x10bd47;
  fdb_get_default_kvs_config();
  pcStack_950 = (code *)0x10bd53;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_869 = 0;
  uStack_7c8._0_4_ = 100;
  uStack_7c8._4_1_ = false;
  uStack_7c8._5_3_ = 0;
  pcStack_950 = (code *)0x10bd76;
  fVar2 = fdb_open(&pfStack_940,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_950 = (code *)0x10bd97;
    fVar2 = fdb_kvs_open(pfStack_940,&pfStack_948,"num_keep",(fdb_kvs_config *)(auStack_928 + 0x20))
    ;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfec;
    pfVar6 = (fdb_kvs_handle *)0x0;
    pcVar13 = "key";
    pcVar23 = "val";
    pcVar21 = auStack_8e0;
    do {
      pcStack_950 = (code *)0x10bdcf;
      fVar2 = fdb_set_kv(pfStack_948,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bfd0:
        pcStack_950 = (code *)0x10bfd7;
        verify_high_num_keeping_headers_param_test();
        goto LAB_0010bfd7;
      }
      pcStack_950 = (code *)0x10bde4;
      fVar2 = fdb_get_file_info(pfStack_940,(fdb_file_info *)pcVar21);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_950 = (code *)0x10bfd0;
        verify_high_num_keeping_headers_param_test();
        goto LAB_0010bfd0;
      }
      pfVar6 = (fdb_kvs_handle *)((long)&pfVar6[-1].bub_ctx.handle + 7);
    } while ((ulong)auStack_8e0._40_8_ < 0x1000001);
    pcStack_950 = (code *)0x10be0c;
    fVar2 = fdb_commit(pfStack_940,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bff3;
    pcVar13 = "key%d";
    pcVar23 = auStack_928;
    pcVar21 = "reu";
    keylen = 0;
    do {
      pcStack_950 = (code *)0x10be38;
      sprintf(pcVar23,"key%d",keylen);
      handle._M_i = (__int_type)pfStack_948;
      pcStack_950 = (code *)0x10be44;
      sVar5 = strlen(pcVar23);
      pcStack_950 = (code *)0x10be5b;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar23,sVar5,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfde;
      pcStack_950 = (code *)0x10be72;
      fVar2 = fdb_commit(pfStack_940,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfd7;
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 100);
    pcVar13 = "key";
    pcVar23 = "val";
    keylen = (ulong)pfVar6 & 0xffffffff;
    do {
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
      if (uVar17 == 0) goto LAB_0010bebb;
      pcStack_950 = (code *)0x10beb0;
      fVar2 = fdb_set_kv(pfStack_948,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_950 = (code *)0x10bebb;
    verify_high_num_keeping_headers_param_test();
LAB_0010bebb:
    pcStack_950 = (code *)0x10beca;
    fVar2 = fdb_commit(pfStack_940,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bffa;
    pcStack_950 = (code *)0x10bee6;
    fVar2 = fdb_snapshot_open(pfStack_948,&pfStack_938,-(long)pfVar6);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c001;
    pcStack_950 = (code *)0x10bf05;
    fVar2 = fdb_snapshot_open(pfStack_948,&pfStack_938,1 - (long)pfVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c006;
    pcVar23 = auStack_928;
    pcStack_950 = (code *)0x10bf1e;
    sVar5 = strlen(pcVar23);
    pcStack_950 = (code *)0x10bf36;
    fVar2 = fdb_get_kv(pfStack_948,pcVar23,sVar5,&pvStack_930,(size_t *)(auStack_928 + 0x18));
    pcVar13 = (char *)pfStack_948;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c00d;
    pcStack_950 = (code *)0x10bf48;
    fVar2 = fdb_free_block(pvStack_930);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c014;
    pcStack_950 = (code *)0x10bf5a;
    fVar2 = fdb_kvs_close(pfStack_938);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c01b;
    pcStack_950 = (code *)0x10bf6c;
    fVar2 = fdb_close(pfStack_940);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c022;
    pcStack_950 = (code *)0x10bf79;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_950 = (code *)0x10bf86;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (verify_high_num_keeping_headers_param_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_950 = (code *)0x10bfb7;
      fprintf(_stderr,pcVar21,"verify high num keeping headers param test");
      return;
    }
  }
  else {
LAB_0010bfe5:
    pcStack_950 = (code *)0x10bfec;
    verify_high_num_keeping_headers_param_test();
LAB_0010bfec:
    pcStack_950 = (code *)0x10bff3;
    verify_high_num_keeping_headers_param_test();
LAB_0010bff3:
    pcStack_950 = (code *)0x10bffa;
    verify_high_num_keeping_headers_param_test();
LAB_0010bffa:
    pcStack_950 = (code *)0x10c001;
    verify_high_num_keeping_headers_param_test();
LAB_0010c001:
    pcStack_950 = (code *)0x10c006;
    verify_high_num_keeping_headers_param_test();
LAB_0010c006:
    pcStack_950 = (code *)0x10c00d;
    verify_high_num_keeping_headers_param_test();
LAB_0010c00d:
    pcStack_950 = (code *)0x10c014;
    verify_high_num_keeping_headers_param_test();
LAB_0010c014:
    pcStack_950 = (code *)0x10c01b;
    verify_high_num_keeping_headers_param_test();
LAB_0010c01b:
    pcStack_950 = (code *)0x10c022;
    verify_high_num_keeping_headers_param_test();
LAB_0010c022:
    pcStack_950 = (code *)0x10c029;
    verify_high_num_keeping_headers_param_test();
    fVar2 = extraout_EAX;
  }
  uVar19 = (ulong)(uint)fVar2;
  pcStack_950 = snapshot_before_block_reuse_test;
  verify_high_num_keeping_headers_param_test();
  pcStack_c18 = (code *)0x10c048;
  pfStack_978 = (fdb_kvs_handle *)pcVar13;
  pfStack_970 = (fdb_kvs_handle *)handle._M_i;
  pfStack_968 = pfVar6;
  pfStack_960 = (fdb_kvs_handle *)pcVar23;
  psStack_958 = (snap_handle *)pcVar21;
  pcStack_950 = (code *)keylen;
  memleak_start();
  pcStack_c18 = (code *)0x10c054;
  gettimeofday(&tStack_bd0,(__timezone_ptr_t)0x0);
  pcVar23 = auStack_bc0 + 0x48;
  pcStack_c18 = (code *)0x10c064;
  fdb_get_default_config();
  pcStack_c18 = (code *)0x10c06e;
  fdb_get_default_kvs_config();
  pcStack_c18 = (code *)0x10c07a;
  system("rm -rf  staleblktest* > errorlog.txt");
  auStack_aa8[0] = '\x01';
  auStack_aa8[1] = '\0';
  auStack_aa8[2] = '\0';
  auStack_aa8[3] = '\0';
  auStack_aa8[4] = '\0';
  auStack_aa8[5] = '\0';
  auStack_aa8[6] = '\0';
  auStack_aa8[7] = '\0';
  pcStack_c18 = (code *)0x10c099;
  fVar2 = fdb_open(&pfStack_c08,"./staleblktest1",(fdb_config *)pcVar23);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_c18 = (code *)0x10c0b3;
    fVar2 = fdb_kvs_open_default(pfStack_c08,&pfStack_c10,&fStack_be8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a6;
    pcStack_c18 = (code *)0x10c0dd;
    fVar2 = fdb_set_kv(pfStack_c10,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ad;
    pcStack_c18 = (code *)0x10c0f4;
    fVar2 = fdb_commit(pfStack_c08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3b4;
    ptr_handle = &pfStack_c00;
    cVar12 = (char)(uVar19 & 0xffffffff);
    pfVar11 = pfStack_c10;
    if (cVar12 == '\0') {
LAB_0010c120:
      pcStack_c18 = (code *)0x10c12a;
      fVar2 = fdb_snapshot_open(pfVar11,ptr_handle,1);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c132;
      goto LAB_0010c3f2;
    }
    pcStack_c18 = (code *)0x10c115;
    fVar2 = fdb_snapshot_open(pfStack_c10,ptr_handle,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfVar11 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      pcStack_c18 = (code *)0x10c120;
      snapshot_before_block_reuse_test();
      goto LAB_0010c120;
    }
LAB_0010c132:
    keylen = 0;
    handle._M_i = (__int_type)auStack_bc0;
    do {
      pcStack_c18 = (code *)0x10c161;
      fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c373;
      pcStack_c18 = (code *)0x10c176;
      fVar2 = fdb_get_file_info(pfStack_c08,(fdb_file_info *)handle._M_i);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c36c;
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
    } while ((ulong)auStack_bc0._40_8_ < (fdb_file_handle *)0x1000001);
    handle._M_i = 0;
    pcVar23 = "key";
    pcVar21 = "val";
    do {
      pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
      do {
        pcStack_c18 = (code *)0x10c1b9;
        fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_c18 = (code *)0x10c36c;
          snapshot_before_block_reuse_test();
          goto LAB_0010c36c;
        }
        uVar22 = (int)pfVar6 - 1;
        pfVar6 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 != 0);
      pcStack_c18 = (code *)0x10c1d5;
      fVar2 = fdb_commit(pfStack_c08,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c37a;
      uVar22 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar22;
    } while (uVar22 != 5);
    pcStack_c18 = (code *)0x10c1ef;
    sVar3 = sb_check_block_reusing(pfStack_c10);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010c3bb;
    pcStack_c18 = (code *)0x10c218;
    fVar2 = fdb_get_kv(pfStack_c00,"key",4,&pfStack_bf8,&sStack_bf0);
    pfVar14 = pfStack_bf8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c0;
    pcStack_c18 = (code *)0x10c239;
    iVar4 = bcmp(pfStack_bf8,"snp",sStack_bf0);
    if (iVar4 != 0) goto LAB_0010c3c7;
    pcStack_c18 = (code *)0x10c24b;
    fVar2 = fdb_kvs_close(pfStack_c00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cf;
    pfVar14 = (fdb_config *)0x147599;
    pcVar21 = "val";
    do {
      pcStack_c18 = (code *)0x10c27b;
      fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c381;
      uVar17 = (int)keylen - 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_c18 = (code *)0x10c296;
    fVar2 = fdb_commit(pfStack_c08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d6;
    pcStack_c18 = (code *)0x10c2b1;
    fVar2 = fdb_snapshot_open(pfStack_c10,&pfStack_c00,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_c18 = (code *)0x10c2c4;
      fVar2 = fdb_free_block(pfStack_bf8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3dd;
      pcStack_c18 = (code *)0x10c2d5;
      fVar2 = fdb_kvs_close(pfStack_c10);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e4;
      pcStack_c18 = (code *)0x10c2e7;
      fVar2 = fdb_close(pfStack_c08);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_c18 = (code *)0x10c2f4;
        fdb_shutdown();
        pcStack_c18 = (code *)0x10c2f9;
        memleak_end();
        pcVar21 = "disk snapshot";
        if (cVar12 != '\0') {
          pcVar21 = "in-mem snapshot";
        }
        pcStack_c18 = (code *)0x10c326;
        sprintf(acStack_a80,"snapshot before block reuse test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStack_c18 = (code *)0x10c353;
        fprintf(_stderr,pcVar21,acStack_a80);
        return;
      }
      goto LAB_0010c3eb;
    }
LAB_0010c388:
    pcVar21 = "val";
    pcVar23 = "key";
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c39a:
      pcStack_c18 = (code *)0x10c39f;
      snapshot_before_block_reuse_test();
      goto LAB_0010c39f;
    }
    pcStack_c18 = (code *)0x10c396;
    fVar2 = fdb_kvs_close(pfStack_c00);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c39a;
  }
  else {
LAB_0010c39f:
    pcStack_c18 = (code *)0x10c3a6;
    snapshot_before_block_reuse_test();
LAB_0010c3a6:
    pcStack_c18 = (code *)0x10c3ad;
    snapshot_before_block_reuse_test();
LAB_0010c3ad:
    pcStack_c18 = (code *)0x10c3b4;
    snapshot_before_block_reuse_test();
LAB_0010c3b4:
    pcStack_c18 = (code *)0x10c3bb;
    snapshot_before_block_reuse_test();
LAB_0010c3bb:
    pcStack_c18 = (code *)0x10c3c0;
    snapshot_before_block_reuse_test();
LAB_0010c3c0:
    pfVar14 = (fdb_config *)pcVar23;
    pcStack_c18 = (code *)0x10c3c7;
    snapshot_before_block_reuse_test();
LAB_0010c3c7:
    pcStack_c18 = (code *)0x10c3cf;
    snapshot_before_block_reuse_test();
LAB_0010c3cf:
    pcStack_c18 = (code *)0x10c3d6;
    snapshot_before_block_reuse_test();
LAB_0010c3d6:
    pcStack_c18 = (code *)0x10c3dd;
    snapshot_before_block_reuse_test();
LAB_0010c3dd:
    pcStack_c18 = (code *)0x10c3e4;
    snapshot_before_block_reuse_test();
LAB_0010c3e4:
    pcStack_c18 = (code *)0x10c3eb;
    snapshot_before_block_reuse_test();
LAB_0010c3eb:
    pcStack_c18 = (code *)0x10c3f2;
    snapshot_before_block_reuse_test();
    pcVar23 = (char *)pfVar14;
LAB_0010c3f2:
    pcStack_c18 = (code *)0x10c3f9;
    snapshot_before_block_reuse_test();
  }
  pcStack_c18 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_de0 = (code *)0x10c416;
  uStack_c40 = uVar19 & 0xffffffff;
  pfStack_c38 = (fdb_kvs_handle *)handle._M_i;
  pfStack_c30 = pfVar6;
  pfStack_c28 = (fdb_config *)pcVar23;
  psStack_c20 = (snap_handle *)pcVar21;
  pcStack_c18 = (code *)keylen;
  memleak_start();
  pcStack_de0 = (code *)0x10c422;
  gettimeofday((timeval *)(auStack_da8 + 0x18),(__timezone_ptr_t)0x0);
  pcVar13 = auStack_d80 + 0x48;
  pcStack_de0 = (code *)0x10c432;
  fdb_get_default_config();
  pcStack_de0 = (code *)0x10c43c;
  fdb_get_default_kvs_config();
  pcStack_de0 = (code *)0x10c448;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_d09 = '\0';
  uStack_c68 = 5;
  pcStack_de0 = (code *)0x10c46b;
  fVar2 = fdb_open(&pfStack_dd0,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_de0 = (code *)0x10c48c;
    fVar2 = fdb_kvs_open(pfStack_dd0,&pfStack_dd8,"num_keep",&fStack_dc0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6a9;
    pfVar6 = (fdb_kvs_handle *)0x0;
    pcVar13 = "key";
    pcVar23 = "val";
    pcVar21 = auStack_d80;
    do {
      pcStack_de0 = (code *)0x10c4c4;
      fVar2 = fdb_set_kv(pfStack_dd8,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c68d:
        pcStack_de0 = (code *)0x10c694;
        snapshot_after_block_reuse_test();
        goto LAB_0010c694;
      }
      pcStack_de0 = (code *)0x10c4d9;
      fVar2 = fdb_get_file_info(pfStack_dd0,(fdb_file_info *)pcVar21);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_de0 = (code *)0x10c68d;
        snapshot_after_block_reuse_test();
        goto LAB_0010c68d;
      }
      pfVar6 = (fdb_kvs_handle *)((long)&pfVar6[-1].bub_ctx.handle + 7);
    } while ((ulong)auStack_d80._40_8_ < 0x1000001);
    pcStack_de0 = (code *)0x10c501;
    fVar2 = fdb_commit(pfStack_dd0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b0;
    pcVar13 = "key%d";
    pcVar23 = auStack_da8;
    pcVar21 = "reu";
    keylen = 0;
    do {
      pcStack_de0 = (code *)0x10c52d;
      sprintf(pcVar23,"key%d",keylen);
      handle._M_i = (__int_type)pfStack_dd8;
      pcStack_de0 = (code *)0x10c539;
      sVar5 = strlen(pcVar23);
      pcStack_de0 = (code *)0x10c550;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar23,sVar5,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c69b;
      pcStack_de0 = (code *)0x10c567;
      fVar2 = fdb_commit(pfStack_dd0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c694;
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 10);
    pcVar13 = "key";
    pcVar23 = "val";
    keylen = (ulong)pfVar6 & 0xffffffff;
    do {
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
      if (uVar17 == 0) goto LAB_0010c5b0;
      pcStack_de0 = (code *)0x10c5a5;
      fVar2 = fdb_set_kv(pfStack_dd8,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_de0 = (code *)0x10c5b0;
    snapshot_after_block_reuse_test();
LAB_0010c5b0:
    pcStack_de0 = (code *)0x10c5bf;
    fVar2 = fdb_commit(pfStack_dd0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b7;
    pcStack_de0 = (code *)0x10c5dd;
    fVar2 = fdb_snapshot_open(pfStack_dd8,&pfStack_dc8,6 - (long)pfVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6be;
    pcStack_de0 = (code *)0x10c5ef;
    fVar2 = fdb_kvs_close(pfStack_dc8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c5;
    pcStack_de0 = (code *)0x10c60d;
    fVar2 = fdb_snapshot_open(pfStack_dd8,&pfStack_dc8,5 - (long)pfVar6);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6cc;
    pcStack_de0 = (code *)0x10c61f;
    fVar2 = fdb_kvs_close(pfStack_dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_de0 = (code *)0x10c631;
    fVar2 = fdb_close(pfStack_dd0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_de0 = (code *)0x10c63e;
      fdb_shutdown();
      pcStack_de0 = (code *)0x10c643;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_de0 = (code *)0x10c674;
      fprintf(_stderr,pcVar21,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6a2:
    pcStack_de0 = (code *)0x10c6a9;
    snapshot_after_block_reuse_test();
LAB_0010c6a9:
    pcStack_de0 = (code *)0x10c6b0;
    snapshot_after_block_reuse_test();
LAB_0010c6b0:
    pcStack_de0 = (code *)0x10c6b7;
    snapshot_after_block_reuse_test();
LAB_0010c6b7:
    pcStack_de0 = (code *)0x10c6be;
    snapshot_after_block_reuse_test();
LAB_0010c6be:
    pcStack_de0 = (code *)0x10c6c5;
    snapshot_after_block_reuse_test();
LAB_0010c6c5:
    pcStack_de0 = (code *)0x10c6cc;
    snapshot_after_block_reuse_test();
LAB_0010c6cc:
    pcStack_de0 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_de0 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
  }
  pcStack_de0 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_f98 = (code *)0x10c6f3;
  pfStack_e00 = (fdb_config *)pcVar13;
  pfStack_df8 = (fdb_kvs_handle *)handle._M_i;
  pfStack_df0 = (fdb_config *)pcVar23;
  psStack_de8 = (snap_handle *)pcVar21;
  pcStack_de0 = (code *)keylen;
  memleak_start();
  pcStack_f98 = (code *)0x10c6ff;
  gettimeofday(&tStack_f50,(__timezone_ptr_t)0x0);
  pfVar14 = (fdb_config *)(auStack_f40 + 0x48);
  pcStack_f98 = (code *)0x10c70f;
  fdb_get_default_config();
  pcStack_f98 = (code *)0x10c719;
  fdb_get_default_kvs_config();
  pcStack_f98 = (code *)0x10c725;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_e28 = 1;
  pcStack_f98 = (code *)0x10c744;
  fVar2 = fdb_open(&pfStack_f88,"./staleblktest1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_f98 = (code *)0x10c75e;
    fVar2 = fdb_kvs_open_default(pfStack_f88,&pfStack_f90,&fStack_f68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0d;
    pcStack_f98 = (code *)0x10c788;
    fVar2 = fdb_set_kv(pfStack_f90,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca14;
    pcStack_f98 = (code *)0x10c79f;
    fVar2 = fdb_commit(pfStack_f88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1b;
    pcStack_f98 = (code *)0x10c7bc;
    fVar2 = fdb_snapshot_open(pfStack_f90,&pfStack_f80,0xffffffffffffffff);
    pfVar15 = pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca22;
    keylen = 0;
    pcVar21 = auStack_f40;
    do {
      pcStack_f98 = (code *)0x10c7f3;
      fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9da;
      pcStack_f98 = (code *)0x10c808;
      fVar2 = fdb_get_file_info(pfStack_f88,(fdb_file_info *)pcVar21);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9d3;
      uVar17 = (int)keylen + 1;
      keylen = (size_t)uVar17;
    } while ((ulong)auStack_f40._40_8_ < 0x1000001);
    pcVar21 = (char *)0x0;
    pfVar15 = (fdb_config *)0x147599;
    pcVar23 = "val";
    do {
      handle._M_i = (__int_type)uVar17;
      do {
        pcStack_f98 = (code *)0x10c84b;
        fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_f98 = (code *)0x10c9d3;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010c9d3;
        }
        uVar22 = (int)handle._M_i - 1;
        handle._M_i = (__int_type)uVar22;
      } while (uVar22 != 0);
      pcStack_f98 = (code *)0x10c867;
      fVar2 = fdb_commit(pfStack_f88,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e1;
      uVar22 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar22;
    } while (uVar22 != 5);
    pcStack_f98 = (code *)0x10c881;
    sVar3 = sb_check_block_reusing(pfStack_f90);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca29;
    pcStack_f98 = (code *)0x10c8aa;
    fVar2 = fdb_get_kv(pfStack_f80,"key",4,&pfStack_f78,&sStack_f70);
    pfVar14 = pfStack_f78;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2e;
    pcStack_f98 = (code *)0x10c8cb;
    iVar4 = bcmp(pfStack_f78,"snp",sStack_f70);
    if (iVar4 != 0) goto LAB_0010ca35;
    pcStack_f98 = (code *)0x10c8dd;
    fVar2 = fdb_kvs_close(pfStack_f80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3d;
    pfVar14 = (fdb_config *)0x147599;
    pcVar23 = "val";
    do {
      pcStack_f98 = (code *)0x10c90d;
      fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e8;
      uVar17 = (int)keylen - 1;
      keylen = (size_t)uVar17;
    } while (uVar17 != 0);
    pcStack_f98 = (code *)0x10c928;
    fVar2 = fdb_commit(pfStack_f88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca44;
    pcStack_f98 = (code *)0x10c943;
    fVar2 = fdb_snapshot_open(pfStack_f90,&pfStack_f80,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_f98 = (code *)0x10c956;
      fVar2 = fdb_free_block(pfStack_f78);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
      pcStack_f98 = (code *)0x10c967;
      fVar2 = fdb_kvs_close(pfStack_f90);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca52;
      pcStack_f98 = (code *)0x10c979;
      fVar2 = fdb_close(pfStack_f88);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_f98 = (code *)0x10c986;
        fdb_shutdown();
        pcStack_f98 = (code *)0x10c98b;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStack_f98 = (code *)0x10c9bc;
        fprintf(_stderr,pcVar21,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca59;
    }
LAB_0010c9ef:
    pcVar23 = "val";
    pfVar14 = (fdb_config *)0x147599;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010ca01:
      pcStack_f98 = (code *)0x10ca06;
      snapshot_inmem_before_block_reuse_test();
      goto LAB_0010ca06;
    }
    pcStack_f98 = (code *)0x10c9fd;
    fVar2 = fdb_kvs_close(pfStack_f80);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010ca01;
  }
  else {
LAB_0010ca06:
    pcStack_f98 = (code *)0x10ca0d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca0d:
    pcStack_f98 = (code *)0x10ca14;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca14:
    pcStack_f98 = (code *)0x10ca1b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca1b:
    pcStack_f98 = (code *)0x10ca22;
    snapshot_inmem_before_block_reuse_test();
    pfVar15 = pfVar14;
LAB_0010ca22:
    pcStack_f98 = (code *)0x10ca29;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca29:
    pcStack_f98 = (code *)0x10ca2e;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2e:
    pfVar14 = pfVar15;
    pcStack_f98 = (code *)0x10ca35;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca35:
    pcStack_f98 = (code *)0x10ca3d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3d:
    pcStack_f98 = (code *)0x10ca44;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca44:
    pcStack_f98 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pcStack_f98 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_f98 = (code *)0x10ca59;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca59:
    pcStack_f98 = (code *)0x10ca60;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_f98 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar24.seqtree = (btree *)0x0;
  pcStack_1280 = (code *)0x10ca87;
  pfStack_fc0 = pfVar14;
  pfStack_fb8 = (fdb_kvs_handle *)handle._M_i;
  pfStack_fb0 = pfVar6;
  pfStack_fa8 = (fdb_config *)pcVar23;
  psStack_fa0 = (snap_handle *)pcVar21;
  pcStack_f98 = (code *)keylen;
  gettimeofday(&tStack_1228,(__timezone_ptr_t)0x0);
  pcStack_1280 = (code *)0x10ca8c;
  memleak_start();
  pcStack_1280 = (code *)0x10ca96;
  pcVar23 = (char *)operator_new__(0x500000);
  pcVar21 = auStack_1218;
  pcStack_1280 = (code *)0x10caa6;
  fdb_get_default_kvs_config();
  pfVar14 = &fStack_10b8;
  pcStack_1280 = (code *)0x10cab6;
  fdb_get_default_config();
  fStack_10b8.compaction_threshold = '\0';
  fStack_10b8.block_reusing_threshold = 0x41;
  pcStack_1280 = (code *)0x10cad4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle_00.seqtree = (btree *)&pfStack_1270;
  pcStack_1280 = (code *)0x10caeb;
  fdb_open((fdb_file_handle **)handle_00.seqtree,"./staleblktest1",pfVar14);
  pcStack_1280 = (code *)0x10cafa;
  fdb_kvs_open_default
            (pfStack_1270,(fdb_kvs_handle **)&aStack_1278.seqtree,(fdb_kvs_config *)pcVar21);
  if (fStack_10b8.num_keeping_headers != 0xffffffffffffffff) {
    pcVar13 = "%d_key";
    pcVar21 = (char *)&fStack_11b8;
    aVar24.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_1268 = CONCAT44(sStack_1268._4_4_,iVar4 + 3);
      pfVar14 = (fdb_config *)0x1ff;
      aStack_1260 = aVar24;
      do {
        pcStack_1280 = (code *)0x10cb40;
        sprintf(pcVar21,"%d_key",(ulong)((int)pfVar14 + 1));
        pcStack_1280 = (code *)0x10cb50;
        memset(pcVar23,0x61,(size_t)pfVar14);
        handle_00 = aStack_1278;
        pcVar23[(long)pfVar14] = '\0';
        pcStack_1280 = (code *)0x10cb61;
        sVar5 = strlen(pcVar21);
        keylen = sVar5 + 1;
        pcStack_1280 = (code *)0x10cb6d;
        sVar5 = strlen(pcVar23);
        pcStack_1280 = (code *)0x10cb82;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar21,keylen,pcVar23,sVar5 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d063;
        pfVar14 = (fdb_config *)&pfVar14[2].wal_threshold;
      } while (pfVar14 != (fdb_config *)0x7ff);
      pcStack_1280 = (code *)0x10cba9;
      fVar2 = fdb_commit(pfStack_1270,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d071;
      aVar24.seqtree = (btree *)&(aStack_1260.seqtree)->vsize;
      iVar4 = (int)sStack_1268;
    } while (aVar24.seqtree < (undefined1 *)(fStack_10b8.num_keeping_headers + 1));
    aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_1268;
  }
  pcStack_1280 = (code *)0x10cbe5;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1278.seqtree,
                            (fdb_kvs_handle **)&aStack_1240.seqtree,(fdb_seqnum_t)aVar24);
  sVar20 = keylen;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar7 = 0xffffffff;
    pcVar21 = "%d_key";
    pfVar14 = &fStack_11b8;
    handle_00.seqtree = (btree *)0x0;
LAB_0010cc04:
    keylen = 0x3ff;
    sStack_1268 = sVar7;
    aStack_1260 = handle_00;
LAB_0010cc13:
    pcStack_1280 = (code *)0x10cc23;
    sprintf((char *)pfVar14,"%d_key",(ulong)((int)keylen + 1));
    pcStack_1280 = (code *)0x10cc33;
    memset(pcVar23,0x62,keylen);
    handle_00 = aStack_1278;
    pcVar23[keylen] = '\0';
    pcStack_1280 = (code *)0x10cc43;
    sVar5 = strlen((char *)pfVar14);
    pcVar13 = (char *)(sVar5 + 1);
    pcStack_1280 = (code *)0x10cc4f;
    sVar5 = strlen(pcVar23);
    pcStack_1280 = (code *)0x10cc64;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pfVar14,(size_t)pcVar13,pcVar23,sVar5 + 1
                      );
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc6c;
    pcStack_1280 = (code *)0x10d063;
    variable_value_size_test();
LAB_0010d063:
    pcStack_1280 = (code *)0x10d06a;
    variable_value_size_test();
    goto LAB_0010d06a;
  }
LAB_0010d086:
  pcStack_1280 = (code *)0x10d08d;
  variable_value_size_test();
LAB_0010d08d:
  pcStack_1280 = (code *)0x10d092;
  variable_value_size_test();
LAB_0010d092:
  pcStack_1280 = (code *)0x10d099;
  variable_value_size_test();
LAB_0010d099:
  pcStack_1280 = (code *)0x10d0a0;
  variable_value_size_test();
LAB_0010d0a0:
  pcStack_1280 = (code *)0x10d0a7;
  variable_value_size_test();
LAB_0010d0a7:
  pcStack_1280 = (code *)0x10d0ae;
  variable_value_size_test();
LAB_0010d0ae:
  pcStack_1280 = (code *)0x10d0b5;
  variable_value_size_test();
LAB_0010d0b5:
  aVar25 = aVar24;
  pcStack_1280 = (code *)0x10d0bc;
  variable_value_size_test();
LAB_0010d0bc:
  pcStack_1280 = (code *)0x10d0c4;
  variable_value_size_test();
LAB_0010d0c4:
  pcStack_1280 = (code *)0x10d0cb;
  variable_value_size_test();
LAB_0010d0cb:
  pcStack_1280 = (code *)0x10d0d2;
  variable_value_size_test();
LAB_0010d0d2:
  pcStack_1280 = (code *)0x10d0da;
  variable_value_size_test();
LAB_0010d0da:
  pcStack_1280 = (code *)0x10d0e1;
  variable_value_size_test();
LAB_0010d0e1:
  pcStack_1280 = (code *)0x10d0e8;
  variable_value_size_test();
LAB_0010d0e8:
  pcStack_1280 = (code *)0x10d0ef;
  variable_value_size_test();
LAB_0010d0ef:
  pcStack_1280 = (code *)0x10d0f6;
  variable_value_size_test();
LAB_0010d0f6:
  pcStack_1280 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_1958 = (code *)0x10d11a;
  pcStack_12a8 = pcVar23;
  pfStack_12a0 = pfVar14;
  aStack_1298 = handle_00;
  aStack_1290 = aVar25;
  aStack_1288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
  pcStack_1280 = (code *)sVar20;
  gettimeofday(&tStack_1910,(__timezone_ptr_t)0x0);
  pcStack_1958 = (code *)0x10d11f;
  memleak_start();
  pcStack_1958 = (code *)0x10d12c;
  fdb_get_default_kvs_config();
  pcStack_1958 = (code *)0x10d13c;
  fdb_get_default_config();
  fStack_13a0.compaction_threshold = '\0';
  fStack_13a0.block_reusing_threshold = 0x41;
  fStack_13a0.num_keeping_headers = 1;
  pcStack_1958 = (code *)0x10d163;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1958 = (code *)0x10d17a;
  fdb_open(&pfStack_1948,"./staleblktest1",&fStack_13a0);
  pcStack_1958 = (code *)0x10d188;
  fdb_kvs_open_default(pfStack_1948,&pfStack_1950,&fStack_1900);
  pcVar16 = "%dkey";
  pcVar23 = acStack_18a0;
  pcVar13 = acStack_17a0;
  pcVar21 = (char *)0x0;
  do {
    pcStack_1958 = (code *)0x10d1b0;
    sprintf(pcVar23,"%dkey",pcVar21);
    pcStack_1958 = (code *)0x10d1c2;
    memset(pcVar13,0x62,0x1ff);
    pfVar6 = pfStack_1950;
    uStack_15a1 = 0;
    pcStack_1958 = (code *)0x10d1d6;
    sVar8 = strlen(pcVar23);
    pcStack_1958 = (code *)0x10d1e1;
    sVar5 = strlen(pcVar13);
    pcStack_1958 = (code *)0x10d1f5;
    fVar2 = fdb_set_kv(pfVar6,pcVar23,sVar8,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d445:
      pcStack_1958 = (code *)0x10d44c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d44c;
    }
    pcStack_1958 = (code *)0x10d20c;
    fVar2 = fdb_commit(pfStack_1948,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1958 = (code *)0x10d445;
      rollback_with_num_keeping_headers();
      goto LAB_0010d445;
    }
    uVar17 = (int)pcVar21 + 1;
    pcVar21 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar13 = (char *)0x0;
  pcVar21 = acStack_18a0;
  pcVar23 = acStack_17a0;
  pcVar16 = (char *)0x0;
  do {
    pfVar6 = pfStack_1950;
    builtin_strncpy(acStack_18a0,"0key",5);
    builtin_strncpy(acStack_17a0,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_1958 = (code *)0x10d29e;
    sVar8 = strlen(pcVar21);
    pcStack_1958 = (code *)0x10d2a9;
    sVar5 = strlen(pcVar23);
    pcStack_1958 = (code *)0x10d2bd;
    fVar2 = fdb_set_kv(pfVar6,pcVar21,sVar8,pcVar23,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d453;
    pcStack_1958 = (code *)0x10d2d4;
    fVar2 = fdb_get_file_info(pfStack_1948,&fStack_18e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d44c;
    uVar17 = (int)pcVar16 + 1;
    pcVar16 = (char *)(ulong)uVar17;
  } while (fStack_18e8.file_size < 0x1000000);
  pcStack_1958 = (code *)0x10d2f9;
  sVar3 = sb_check_block_reusing(pfStack_1950);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1958 = (code *)0x10d311;
    fVar2 = fdb_commit(pfStack_1948,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d466;
    pcVar23 = acStack_18a0;
    pcVar13 = acStack_17a0;
    pcVar21 = (char *)0x0;
    do {
      pcStack_1958 = (code *)0x10d33e;
      sprintf(pcVar23,"%dkey",pcVar21);
      pcStack_1958 = (code *)0x10d350;
      memset(pcVar13,100,0x1ff);
      pfVar6 = pfStack_1950;
      uStack_15a1 = 0;
      pcStack_1958 = (code *)0x10d364;
      sVar8 = strlen(pcVar23);
      pcStack_1958 = (code *)0x10d36f;
      sVar5 = strlen(pcVar13);
      pcStack_1958 = (code *)0x10d383;
      fVar2 = fdb_set_kv(pfVar6,pcVar23,sVar8,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d45a;
      uVar22 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStack_1958 = (code *)0x10d39e;
    fVar2 = fdb_rollback(&pfStack_1950,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46d;
    pcStack_1958 = (code *)0x10d3b4;
    fVar2 = fdb_get_kvs_info(pfStack_1950,&fStack_1940);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d474;
    if (fStack_1940.doc_count != 10) {
      pcStack_1958 = (code *)0x10d3ce;
      rollback_with_num_keeping_headers();
    }
    pcStack_1958 = (code *)0x10d3d7;
    fVar2 = fdb_kvs_close(pfStack_1950);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47b;
    pcStack_1958 = (code *)0x10d3e9;
    fVar2 = fdb_close(pfStack_1948);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1958 = (code *)0x10d3f6;
      fdb_shutdown();
      pcStack_1958 = (code *)0x10d3fb;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_1958 = (code *)0x10d42c;
      fprintf(_stderr,pcVar21,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d461:
    pcStack_1958 = (code *)0x10d466;
    rollback_with_num_keeping_headers();
LAB_0010d466:
    pcStack_1958 = (code *)0x10d46d;
    rollback_with_num_keeping_headers();
LAB_0010d46d:
    pcStack_1958 = (code *)0x10d474;
    rollback_with_num_keeping_headers();
LAB_0010d474:
    pcStack_1958 = (code *)0x10d47b;
    rollback_with_num_keeping_headers();
LAB_0010d47b:
    pcStack_1958 = (code *)0x10d482;
    rollback_with_num_keeping_headers();
  }
  pcStack_1958 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_1e40 = (code *)0x10d4a6;
  fStack_1b78.bub_ctx.space_used = (uint64_t)pcVar16;
  sStack_1970 = sVar8;
  pcStack_1968 = pcVar23;
  pcStack_1960 = pcVar13;
  pcStack_1958 = (code *)pcVar21;
  gettimeofday(&tStack_1e00,(__timezone_ptr_t)0x0);
  pcStack_1e40 = (code *)0x10d4ab;
  memleak_start();
  pcStack_1e40 = (code *)0x10d4b8;
  fdb_get_default_kvs_config();
  pcStack_1e40 = (code *)0x10d4c8;
  fdb_get_default_config();
  fStack_1b78.config.block_reusing_threshold._7_1_ = 0;
  fStack_1b78.max_seqnum = 0x41;
  fStack_1b78.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1b78.dirty_updates = '\0';
  fStack_1b78._466_6_ = 0;
  pcStack_1e40 = (code *)0x10d4ef;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1e40 = (code *)0x10d506;
  fdb_open(&pfStack_1e30,"./staleblktest1file.1",(fdb_config *)&fStack_1b78.config.encryption_key);
  pcStack_1e40 = (code *)0x10d51b;
  fdb_kvs_open(pfStack_1e30,&pfStack_1e38,"./staleblktest1",&fStack_1e18);
  pcVar23 = "%dkey";
  pfVar6 = &fStack_1b78;
  pfVar11 = (fdb_kvs_handle *)auStack_1d78;
  pcVar21 = (char *)0x0;
  do {
    pcStack_1e40 = (code *)0x10d543;
    sprintf((char *)pfVar6,"%dkey",pcVar21);
    pcStack_1e40 = (code *)0x10d555;
    memset(pfVar11,0x62,0x1ff);
    pfVar10 = pfStack_1e38;
    auStack_1d78[0x1ff] = 0;
    pcStack_1e40 = (code *)0x10d569;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar6);
    pcStack_1e40 = (code *)0x10d574;
    sVar5 = strlen((char *)pfVar11);
    pcStack_1e40 = (code *)0x10d588;
    fVar2 = fdb_set_kv(pfVar10,pfVar6,(size_t)pfVar9,pfVar11,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d9e8:
      pcStack_1e40 = (code *)0x10d9ef;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9ef;
    }
    pcStack_1e40 = (code *)0x10d59f;
    fVar2 = fdb_commit(pfStack_1e30,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1e40 = (code *)0x10d9e8;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9e8;
    }
    uVar17 = (int)pcVar21 + 1;
    pcVar21 = (char *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pfVar11 = (fdb_kvs_handle *)0x0;
  pcVar23 = (char *)&fStack_1b78;
  pcVar21 = auStack_1d78;
  pfVar6 = (fdb_kvs_handle *)0x0;
  do {
    pfVar10 = pfStack_1e38;
    fStack_1b78.kvs_config._4_1_ = 0;
    fStack_1b78.kvs_config.create_if_missing = true;
    fStack_1b78.kvs_config._1_3_ = 0x79656b;
    auStack_1d78._0_8_ = 0x6363636363636363;
    auStack_1d78._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1d78._16_8_ = (void *)0x6363636363636363;
    auStack_1d78._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1d78._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1d78._40_7_ = 0x63636363636363;
    auStack_1d78[0x2f] = 99;
    auStack_1d78._48_7_ = 0x63636363636363;
    auStack_1d78[0x37] = 99;
    auStack_1d78._56_7_ = 0x63636363636363;
    auStack_1d78[0x3f] = 99;
    auStack_1d78._64_8_ = (btree *)0x6363636363636363;
    auStack_1d78._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1d78._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1d78._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1d78._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1d78._104_7_ = 0x63636363636363;
    auStack_1d78[0x6f] = 99;
    auStack_1d78._112_7_ = 0x63636363636363;
    auStack_1d78._119_8_ = 0x6363636363636363;
    auStack_1d78[0x7f] = 0;
    pcStack_1e40 = (code *)0x10d632;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar23);
    pcStack_1e40 = (code *)0x10d63d;
    sVar5 = strlen(pcVar21);
    pcStack_1e40 = (code *)0x10d651;
    fVar2 = fdb_set_kv(pfVar10,pcVar23,(size_t)pfVar9,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9f6;
    pcStack_1e40 = (code *)0x10d668;
    fVar2 = fdb_get_file_info(pfStack_1e30,&fStack_1df0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9ef;
    pfVar6 = (fdb_kvs_handle *)(ulong)((int)pfVar6 + 1);
  } while (fStack_1df0.file_size < 0x1000000);
  pcStack_1e40 = (code *)0x10d68b;
  sVar3 = sb_check_block_reusing(pfStack_1e38);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1e40 = (code *)0x10d6a3;
    fVar2 = fdb_commit(pfStack_1e30,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da25;
    pcStack_1e40 = (code *)0x10d6bc;
    fVar2 = fdb_get_kvs_info(pfStack_1e38,&fStack_1da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2c;
    pfStack_1e28 = (fdb_kvs_handle *)fStack_1da8.last_seqnum;
    pfVar11 = &fStack_1b78;
    pfVar10 = (fdb_kvs_handle *)auStack_1d78;
    pcVar21 = (char *)0x0;
    do {
      pcStack_1e40 = (code *)0x10d6f6;
      sprintf((char *)pfVar11,"%dkey",pcVar21);
      pfVar9 = pfStack_1e38;
      auStack_1d78._0_8_ = 0x6464646464646464;
      auStack_1d78._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1d78._16_8_ = (void *)0x6464646464646464;
      auStack_1d78._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1d78._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1d78._40_7_ = 0x64646464646464;
      auStack_1d78[0x2f] = 100;
      auStack_1d78._48_7_ = 0x64646464646464;
      auStack_1d78[0x37] = 100;
      auStack_1d78._56_7_ = 0x64646464646464;
      auStack_1d78[0x3f] = 0;
      pcStack_1e40 = (code *)0x10d731;
      pcVar23 = (char *)strlen((char *)pfVar11);
      pcStack_1e40 = (code *)0x10d73c;
      sVar5 = strlen((char *)pfVar10);
      pcStack_1e40 = (code *)0x10d750;
      fVar2 = fdb_set_kv(pfVar9,pfVar11,(size_t)pcVar23,pfVar10,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da04;
      pcStack_1e40 = (code *)0x10d767;
      fVar2 = fdb_commit(pfStack_1e30,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9fd;
      uVar17 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar17;
    } while (uVar17 != 10);
    pcStack_1e40 = (code *)0x10d783;
    fVar2 = fdb_kvs_close(pfStack_1e38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da33;
    pcStack_1e40 = (code *)0x10d795;
    fVar2 = fdb_close(pfStack_1e30);
    pcVar23 = (char *)pfStack_1e28;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da3a;
    pcStack_1e40 = (code *)0x10d7a7;
    fdb_shutdown();
    pcStack_1e40 = (code *)0x10d7c0;
    fVar2 = fdb_open(&pfStack_1e30,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1b78.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da41;
    pcStack_1e40 = (code *)0x10d7e1;
    fdb_kvs_open(pfStack_1e30,&pfStack_1e38,"./staleblktest1",&fStack_1e18);
    pcStack_1e40 = (code *)0x10d7f0;
    fVar2 = fdb_get_file_info(pfStack_1e30,&fStack_1df0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da48;
    pcStack_1e40 = (code *)0x10d818;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_1df0.file_size,
                       (ulong)(((uint)fStack_1b78.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1b78.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da4f;
    pcStack_1e40 = (code *)0x10d831;
    fVar2 = fdb_snapshot_open(pfStack_1e38,&pfStack_1e20,(fdb_seqnum_t)pcVar23);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da54;
    pcStack_1e40 = (code *)0x10d844;
    fVar2 = fdb_rollback(&pfStack_1e38,(fdb_seqnum_t)pcVar23);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5b;
    pcStack_1e40 = (code *)0x10d85d;
    fVar2 = fdb_compact(pfStack_1e30,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da62;
    pcVar23 = "%dkey";
    pfVar10 = &fStack_1b78;
    pcVar21 = (char *)0x0;
    do {
      pcStack_1e40 = (code *)0x10d885;
      sprintf((char *)pfVar10,"%dkey",pcVar21);
      pfVar11 = pfStack_1e38;
      pcStack_1e40 = (code *)0x10d891;
      sVar5 = strlen((char *)pfVar10);
      pcStack_1e40 = (code *)0x10d89f;
      fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da12;
      pcStack_1e40 = (code *)0x10d8b6;
      fVar2 = fdb_commit(pfStack_1e30,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0b;
      uVar17 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar17;
    } while (uVar17 != 0xb);
    pcStack_1e40 = (code *)0x10d8ce;
    sVar3 = sb_check_block_reusing(pfStack_1e38);
    if (sVar3 != SBD_NONE) goto LAB_0010da69;
    pcVar21 = (char *)0x0;
    pcVar23 = auStack_1d78;
    pfVar9 = &fStack_1b78;
    do {
      fStack_1b78.kvs_config._4_1_ = 0;
      fStack_1b78.kvs_config.create_if_missing = true;
      fStack_1b78.kvs_config._1_3_ = 0x79656b;
      pcStack_1e40 = (code *)0x10d90d;
      memset(pcVar23,0x65,0x1ff);
      pfVar11 = pfStack_1e38;
      auStack_1d78[0x1ff] = 0;
      pcStack_1e40 = (code *)0x10d921;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar9);
      pcStack_1e40 = (code *)0x10d92c;
      sVar5 = strlen(pcVar23);
      pcStack_1e40 = (code *)0x10d940;
      fVar2 = fdb_set_kv(pfVar11,pfVar9,(size_t)pfVar10,pcVar23,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da19;
      uVar17 = (int)pfVar6 - 1;
      pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar17 != 0);
    pcStack_1e40 = (code *)0x10d956;
    sVar3 = sb_check_block_reusing(pfStack_1e38);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da6e;
    pcStack_1e40 = (code *)0x10d969;
    fVar2 = fdb_kvs_close(pfStack_1e20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da73;
    pcStack_1e40 = (code *)0x10d97a;
    fVar2 = fdb_kvs_close(pfStack_1e38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7a;
    pcStack_1e40 = (code *)0x10d98c;
    fVar2 = fdb_close(pfStack_1e30);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1e40 = (code *)0x10d999;
      fdb_shutdown();
      pcStack_1e40 = (code *)0x10d99e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_1e40 = (code *)0x10d9cf;
      fprintf(_stderr,pcVar21,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da20:
    pcStack_1e40 = (code *)0x10da25;
    crash_and_recover_with_num_keeping_test();
LAB_0010da25:
    pcStack_1e40 = (code *)0x10da2c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da2c:
    pcStack_1e40 = (code *)0x10da33;
    crash_and_recover_with_num_keeping_test();
LAB_0010da33:
    pcStack_1e40 = (code *)0x10da3a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da3a:
    pcStack_1e40 = (code *)0x10da41;
    crash_and_recover_with_num_keeping_test();
LAB_0010da41:
    pcStack_1e40 = (code *)0x10da48;
    crash_and_recover_with_num_keeping_test();
LAB_0010da48:
    pcStack_1e40 = (code *)0x10da4f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4f:
    pcStack_1e40 = (code *)0x10da54;
    crash_and_recover_with_num_keeping_test();
LAB_0010da54:
    pcStack_1e40 = (code *)0x10da5b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5b:
    pcStack_1e40 = (code *)0x10da62;
    crash_and_recover_with_num_keeping_test();
LAB_0010da62:
    pcStack_1e40 = (code *)0x10da69;
    crash_and_recover_with_num_keeping_test();
LAB_0010da69:
    pcStack_1e40 = (code *)0x10da6e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6e:
    pcStack_1e40 = (code *)0x10da73;
    crash_and_recover_with_num_keeping_test();
LAB_0010da73:
    pcStack_1e40 = (code *)0x10da7a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7a:
    pcStack_1e40 = (code *)0x10da81;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_1e40 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_22e8 = (fdb_kvs_handle *)0x10daa5;
  pfStack_1e68 = (fdb_kvs_handle *)pcVar23;
  pfStack_1e60 = pfVar10;
  pfStack_1e58 = pfVar9;
  pfStack_1e50 = pfVar6;
  pfStack_1e48 = pfVar11;
  pcStack_1e40 = (code *)pcVar21;
  gettimeofday(&tStack_22d0,(__timezone_ptr_t)0x0);
  pfStack_22e8 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_22e8 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_22e8 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  uStack_1f31 = 0;
  pfStack_1ea8 = (fdb_kvs_handle *)0x41;
  uStack_1e90 = 10;
  pfStack_22e8 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_22e8 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&pfStack_22d8,"./staleblktest1",(fdb_config *)(auStack_20a8 + 0x148));
  pfStack_22e8 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(pfStack_22d8,&pfStack_22e0,(fdb_kvs_config *)(auStack_22c0 + 0x200));
  pcVar13 = "%dkey";
  pcVar23 = auStack_20a8 + 0x48;
  pcVar21 = auStack_22c0;
  pfVar6 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_22e8 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar23,"%dkey",pfVar6);
    pfStack_22e8 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar21,0x62,0x1ff);
    pfVar11 = pfStack_22e0;
    auStack_22c0[0x1ff] = 0;
    pfStack_22e8 = (fdb_kvs_handle *)0x10db61;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar23);
    pfStack_22e8 = (fdb_kvs_handle *)0x10db6c;
    sVar5 = strlen(pcVar21);
    pfStack_22e8 = (fdb_kvs_handle *)0x10db80;
    fVar2 = fdb_set_kv(pfVar11,pcVar23,(size_t)pfVar10,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_22e8 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_22e8 = (fdb_kvs_handle *)0x10db97;
    fVar2 = fdb_commit(pfStack_22d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar17 = (int)pfVar6 + 1;
    pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar21 = auStack_20a8 + 0x48;
  pfVar11 = (fdb_kvs_handle *)auStack_22c0;
  pfVar10 = (fdb_kvs_handle *)auStack_20a8;
  pcVar13 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar9 = (fdb_kvs_handle *)pcVar13;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar21,"%dkey",pfVar9);
    pfVar6 = pfStack_22e0;
    auStack_22c0._0_8_ = 0x6363636363636363;
    auStack_22c0._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_22c0._16_8_ = (void *)0x6363636363636363;
    auStack_22c0._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_22c0._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_22c0._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_22c0._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_22c0._56_8_ = (btree *)0x6363636363636363;
    auStack_22c0._64_8_ = (btree *)0x6363636363636363;
    auStack_22c0._72_8_ = (filemgr *)0x6363636363636363;
    auStack_22c0._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_22c0._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_22c0._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_22c0._104_7_ = 0x63636363636363;
    auStack_22c0[0x6f] = 99;
    auStack_22c0._112_7_ = 0x63636363636363;
    auStack_22c0._119_8_ = 0x6363636363636363;
    auStack_22c0[0x7f] = 0;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc19;
    pcVar23 = (char *)strlen(pcVar21);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc24;
    sVar5 = strlen((char *)pfVar11);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc38;
    fVar2 = fdb_set_kv(pfVar6,pcVar21,(size_t)pcVar23,pfVar11,sVar5);
    pcVar13 = (char *)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc4d;
    fVar2 = fdb_get_file_info(pfStack_22d8,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar17 = (uint)pfVar9 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while ((ulong)auStack_20a8._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_22e8 = (fdb_kvs_handle *)0x10dc72;
  sVar3 = sb_check_block_reusing(pfStack_22e0);
  if (sVar3 == SBD_NONE) {
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc89;
    fVar2 = fdb_commit(pfStack_22d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
    pcVar23 = "%dkey";
    pcVar21 = auStack_20a8 + 0x48;
    pfVar6 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_22e8 = (fdb_kvs_handle *)0x10dcb5;
      sprintf(pcVar21,"%dkey",pfVar6);
      pfVar11 = pfStack_22e0;
      pfStack_22e8 = (fdb_kvs_handle *)0x10dcc1;
      sVar5 = strlen(pcVar21);
      pfStack_22e8 = (fdb_kvs_handle *)0x10dccf;
      fVar2 = fdb_del_kv(pfVar11,pcVar21,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
      uVar22 = (int)pfVar6 + 1;
      pfVar6 = (fdb_kvs_handle *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dce6;
    sVar3 = sb_check_block_reusing(pfStack_22e0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de48;
    if (2 < (uint)pfVar9) {
      pcVar13 = (char *)(ulong)(uVar17 >> 2);
      pcVar21 = auStack_20a8 + 0x48;
      pfVar11 = (fdb_kvs_handle *)auStack_22c0;
      pfVar6 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd1e;
        sprintf(pcVar21,"%dkey",pfVar6);
        pfVar9 = pfStack_22e0;
        auStack_22c0._0_8_ = 0x6464646464646464;
        auStack_22c0._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_22c0._16_8_ = (void *)0x6464646464646464;
        auStack_22c0._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_22c0._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_22c0._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_22c0._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_22c0._56_8_ = (btree *)0x6464646464646464;
        auStack_22c0._64_8_ = (btree *)0x6464646464646464;
        auStack_22c0._72_8_ = (filemgr *)0x6464646464646464;
        auStack_22c0._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_22c0._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_22c0._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_22c0._104_7_ = 0x64646464646464;
        auStack_22c0[0x6f] = 100;
        auStack_22c0._112_7_ = 0x64646464646464;
        auStack_22c0._119_8_ = 0x6464646464646464;
        auStack_22c0[0x7f] = 0;
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd67;
        pcVar23 = (char *)strlen(pcVar21);
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd72;
        sVar5 = strlen((char *)pfVar11);
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd86;
        fVar2 = fdb_set_kv(pfVar9,pcVar21,(size_t)pcVar23,pfVar11,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
        uVar22 = (int)pfVar6 + 2;
        pfVar6 = (fdb_kvs_handle *)(ulong)uVar22;
      } while (uVar22 < uVar17 >> 2);
    }
    pcVar21 = auStack_20a8 + 0x48;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dda2;
    sVar3 = sb_check_block_reusing(pfStack_22e0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de4d;
    pfStack_22e8 = (fdb_kvs_handle *)0x10ddb5;
    fVar2 = fdb_close(pfStack_22d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
    pfStack_22e8 = (fdb_kvs_handle *)0x10ddc2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x10ddcf;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_22e8 = (fdb_kvs_handle *)0x10de00;
      fprintf(_stderr,pcVar21,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de3c:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de41;
    reuse_on_delete_test();
LAB_0010de41:
    pfVar9 = pfVar10;
    pfStack_22e8 = (fdb_kvs_handle *)0x10de48;
    reuse_on_delete_test();
LAB_0010de48:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de4d;
    reuse_on_delete_test();
LAB_0010de4d:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de52;
    reuse_on_delete_test();
LAB_0010de52:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de59;
    reuse_on_delete_test();
  }
  pfStack_22e8 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_27d0 = (fdb_kvs_handle *)0x10de7d;
  fStack_2508.bub_ctx.space_used = (uint64_t)pcVar13;
  fStack_2508.bub_ctx.handle = pfVar11;
  pfStack_2300 = pfVar9;
  pcStack_22f8 = pcVar23;
  pcStack_22f0 = pcVar21;
  pfStack_22e8 = pfVar6;
  gettimeofday(&tStack_2778,(__timezone_ptr_t)0x0);
  pfStack_27d0 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_27d0 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_27d0 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_2508.config.block_reusing_threshold._7_1_ = 0;
  fStack_2508.max_seqnum = 0x23;
  fStack_2508.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_2508.dirty_updates = '\0';
  fStack_2508._466_6_ = 0;
  pfStack_27d0 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_27d0 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_27b8,"./staleblktest1",(fdb_config *)&fStack_2508.config.encryption_key);
  pfStack_27d0 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_27b8,&pfStack_27c0,&fStack_2768);
  pcVar13 = "%dkey";
  pcVar21 = (char *)&fStack_2508;
  pcVar23 = auStack_2750 + 0x48;
  pfVar6 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_27d0 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar21,"%dkey",pfVar6);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar23,0x61,0x1ff);
    pfVar10 = pfStack_27c0;
    uStack_2509 = 0;
    pfStack_27d0 = (fdb_kvs_handle *)0x10df3c;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar21);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df47;
    sVar5 = strlen(pcVar23);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df5b;
    fVar2 = fdb_set_kv(pfVar10,pcVar21,(size_t)pfVar11,pcVar23,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_27d0 = (fdb_kvs_handle *)0x10df72;
    fVar2 = fdb_commit(pfStack_27b8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar17 = (int)pfVar6 + 1;
    pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
  } while (uVar17 != 0xb);
  pcVar23 = (char *)&fStack_2508;
  pfVar10 = (fdb_kvs_handle *)(auStack_2750 + 0x48);
  pfVar11 = (fdb_kvs_handle *)auStack_2750;
  pcVar13 = (char *)0x0;
  do {
    uVar17 = (uint)pcVar13;
    pfStack_27d0 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar23,"%dkey",pcVar13);
    pfVar6 = pfStack_27c0;
    auStack_2750._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_2700 = (docio_handle *)0x6262626262626262;
    pbStack_26f8 = (btreeblk_handle *)0x6262626262626262;
    pbStack_26f0 = (btree_blk_ops *)0x6262626262626262;
    pfStack_26e8 = (filemgr_ops *)0x6262626262626262;
    fStack_26e0.chunksize = 0x6262;
    fStack_26e0._2_2_ = 0x6262;
    fStack_26e0.blocksize = 0x62626262;
    fStack_26e0.buffercache_size = 0x6262626262626262;
    fStack_26e0.wal_threshold = 0x6262626262626262;
    fStack_26e0.wal_flush_before_commit = true;
    fStack_26e0.auto_commit = true;
    fStack_26e0._26_2_ = 0x6262;
    fStack_26e0.purging_interval = 0x62626262;
    fStack_26e0.seqtree_opt = 'b';
    fStack_26e0.durability_opt = 'b';
    fStack_26e0._34_2_ = 0x6262;
    fStack_26e0.flags = 0x62626262;
    fStack_26e0.compaction_buf_maxsize = 0x62626262;
    fStack_26e0.cleanup_cache_onclose = true;
    fStack_26e0.compress_document_body = true;
    fStack_26e0.compaction_mode = 'b';
    fStack_26e0.compaction_threshold = 'b';
    fStack_26e0.compaction_minimum_filesize = 0x6262626262626262;
    fStack_26e0.compactor_sleep_duration = 0x6262626262626262;
    fStack_26e0.multi_kv_instances = true;
    fStack_26e0._65_6_ = 0x626262626262;
    fStack_26e0._71_1_ = 0x62;
    fStack_26e0.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_26e0._79_8_ = 0x6262626262626262;
    fStack_26e0._87_1_ = 0;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e007;
    pcVar21 = (char *)strlen(pcVar23);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e012;
    sVar5 = strlen((char *)pfVar10);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e026;
    fVar2 = fdb_set_kv(pfVar6,pcVar23,(size_t)pcVar21,pfVar10,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e03b;
    fVar2 = fdb_get_file_info(pfStack_27b8,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar22 = uVar17 + 1;
    pcVar13 = (char *)(ulong)uVar22;
  } while ((ulong)auStack_2750._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_27ac = uVar17;
  if (2 < uVar17) {
    uVar17 = (uVar22 >> 2) + (uint)(uVar22 >> 2 == 0);
    pfVar11 = (fdb_kvs_handle *)(ulong)uVar17;
    pcVar21 = "%dkey";
    pcVar23 = (char *)&fStack_2508;
    pfVar6 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar23,"%dkey",pfVar6);
      pfVar10 = pfStack_27c0;
      pfStack_27d0 = (fdb_kvs_handle *)0x10e09f;
      sVar5 = strlen(pcVar23);
      pfStack_27d0 = (fdb_kvs_handle *)0x10e0ad;
      fVar2 = fdb_del_kv(pfVar10,pcVar23,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar18 = (int)pfVar6 + 1;
      pfVar6 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar17 != uVar18);
  }
  pcVar23 = (char *)&fStack_2508;
  pfStack_27d0 = (fdb_kvs_handle *)0x10e0c6;
  sVar3 = sb_check_block_reusing(pfStack_27c0);
  if (sVar3 == SBD_NONE) {
    pcVar23 = (char *)(pfStack_27c0->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e0ec;
    fVar2 = fdb_compact(pfStack_27b8,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e103;
    fVar2 = fdb_get_kvs_info(pfStack_27c0,&fStack_27a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_27a8.doc_count == 0) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar21 = (char *)(ulong)(uVar22 >> 2);
    if (pcVar23 <=
        (fdb_kvs_handle *)(pfStack_27c0->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar17 = uVar22 >> 1;
    pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
    if (uVar22 >> 2 < uVar17) {
      pcVar23 = "%dkey";
      pfVar10 = &fStack_2508;
      do {
        pfStack_27d0 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar10,"%dkey",pcVar21);
        pfVar11 = pfStack_27c0;
        pfStack_27d0 = (fdb_kvs_handle *)0x10e178;
        sVar5 = strlen((char *)pfVar10);
        pfStack_27d0 = (fdb_kvs_handle *)0x10e186;
        fVar2 = fdb_del_kv(pfVar11,pfVar10,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar18 = (int)pcVar21 + 1;
        pcVar21 = (char *)(ulong)uVar18;
      } while (uVar18 < uVar17);
    }
    pfStack_27d0 = (fdb_kvs_handle *)0x10e1a0;
    sVar3 = sb_check_block_reusing(pfStack_27c0);
    if (sVar3 != SBD_NONE) goto LAB_0010e307;
    if (uVar17 <= uStack_27ac) {
      pcVar21 = "%dkey";
      pcVar23 = (char *)&fStack_2508;
      do {
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar23,"%dkey",pfVar6);
        pfVar10 = pfStack_27c0;
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1d9;
        sVar5 = strlen(pcVar23);
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1e7;
        fVar2 = fdb_del_kv(pfVar10,pcVar23,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar17 = (int)pfVar6 + 1;
        pfVar6 = (fdb_kvs_handle *)(ulong)uVar17;
      } while (uVar22 != uVar17);
    }
    pcVar13 = (char *)0xb;
    do {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e209;
      fVar2 = fdb_commit(pfStack_27b8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar17 = (int)pcVar13 - 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (uVar17 != 0);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e224;
    fVar2 = fdb_get_kvs_info(pfStack_27c0,&fStack_27a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e236;
    sVar3 = sb_check_block_reusing(pfStack_27c0);
    if (sVar3 == SBD_NONE) goto LAB_0010e313;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e24d;
    fVar2 = fdb_commit(pfStack_27b8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e25f;
    fVar2 = fdb_close(pfStack_27b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e26c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar21,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_27d0 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2c98 = (code *)0x10e34a;
  pcStack_27f8 = pcVar13;
  pfStack_27f0 = pfVar10;
  pfStack_27e8 = pfVar11;
  pfStack_27e0 = (fdb_kvs_handle *)pcVar21;
  pfStack_27d8 = (fdb_kvs_handle *)pcVar23;
  pfStack_27d0 = pfVar6;
  gettimeofday(&tStack_2c60,(__timezone_ptr_t)0x0);
  pcStackY_2c98 = (code *)0x10e34f;
  memleak_start();
  pfStack_2c70 = (fdb_doc *)0x0;
  pcStackY_2c98 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_2c98 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_28f0.compaction_threshold = '\0';
  fStack_28f0.block_reusing_threshold = 0x23;
  fStack_28f0.num_keeping_headers = 10;
  pcStackY_2c98 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2c98 = (code *)0x10e3b6;
  fdb_open(&pfStack_2c80,"./staleblktest1",&fStack_28f0);
  pcStackY_2c98 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_2c80,&pfStack_2c88,"db",&fStack_2a50);
  pcStackY_2c98 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_2c80,&pfStack_2c68,"db2",&fStack_2a50);
  pcVar21 = acStack_29f0;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar23 = acStack_2c50;
  pcVar13 = (char *)0x0;
  do {
    pcStackY_2c98 = (code *)0x10e410;
    sprintf(pcVar21,"%dkey",pcVar13);
    pfVar6 = pfStack_2c88;
    builtin_strncpy(acStack_2c50,"aaaaaaaaaaa",0xc);
    pcStackY_2c98 = (code *)0x10e42f;
    sVar8 = strlen(pcVar21);
    pcStackY_2c98 = (code *)0x10e43a;
    sVar5 = strlen(pcVar23);
    pcStackY_2c98 = (code *)0x10e44e;
    fVar2 = fdb_set_kv(pfVar6,pcVar21,sVar8,pcVar23,sVar5);
    pfVar6 = pfStack_2c68;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2c98 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_2c98 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_2c98 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_2c98 = (code *)0x10e463;
    sVar8 = strlen(pcVar21);
    pcStackY_2c98 = (code *)0x10e46e;
    sVar5 = strlen(pcVar23);
    pcStackY_2c98 = (code *)0x10e482;
    fVar2 = fdb_set_kv(pfVar6,pcVar21,sVar8,pcVar23,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_2c98 = (code *)0x10e499;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar17 = (int)pcVar13 + 1;
    pcVar13 = (char *)(ulong)uVar17;
  } while (uVar17 != 10);
  pcVar23 = (char *)0x0;
  pcVar13 = acStack_29f0;
  pcVar21 = acStack_2c50;
  doc = (fdb_doc **)0x0;
  do {
    pfVar6 = pfStack_2c88;
    builtin_strncpy(acStack_29f0,"0key",5);
    builtin_strncpy(acStack_2c50,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2c98 = (code *)0x10e521;
    sVar8 = strlen(pcVar13);
    pcStackY_2c98 = (code *)0x10e52c;
    sVar5 = strlen(pcVar21);
    pcStackY_2c98 = (code *)0x10e540;
    fVar2 = fdb_set_kv(pfVar6,pcVar13,sVar8,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_2c98 = (code *)0x10e55a;
    fVar2 = fdb_get_file_info(pfStack_2c80,&fStack_2a38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar17 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar17;
  } while (fStack_2a38.file_size < 0x1000000);
  pcStackY_2c98 = (code *)0x10e580;
  sVar3 = sb_check_block_reusing(pfStack_2c88);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2c98 = (code *)0x10e598;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar21 = acStack_29f0;
    pcVar23 = acStack_2c50;
    pcVar13 = (char *)0x0;
    do {
      pcStackY_2c98 = (code *)0x10e5c2;
      sprintf(pcVar21,"key%d",pcVar13);
      pfVar6 = pfStack_2c88;
      builtin_strncpy(acStack_2c50,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2c98 = (code *)0x10e612;
      sVar8 = strlen(pcVar21);
      pcStackY_2c98 = (code *)0x10e61d;
      sVar5 = strlen(pcVar23);
      pcStackY_2c98 = (code *)0x10e631;
      fVar2 = fdb_set_kv(pfVar6,pcVar21,sVar8,pcVar23,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar22 = (int)pcVar13 + 1;
      pcVar13 = (char *)(ulong)uVar22;
    } while (uVar17 != uVar22);
    pcStackY_2c98 = (code *)0x10e652;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_2c98 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_2c68,&pfStack_2c78,(void *)0x0,0,(void *)0x0,0,0);
    pcVar13 = (char *)0xa;
    doc = &pfStack_2c70;
    do {
      pcStackY_2c98 = (code *)0x10e691;
      fVar2 = fdb_iterator_get(pfStack_2c78,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_2c98 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_2c70);
      pfStack_2c70 = (fdb_doc *)0x0;
      pcStackY_2c98 = (code *)0x10e6b6;
      fVar2 = fdb_iterator_next(pfStack_2c78);
      uVar17 = (int)pcVar13 - 1;
      pcVar13 = (char *)(ulong)uVar17;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar17 != 0) goto LAB_0010e794;
    pcStackY_2c98 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_2c78);
    pcStackY_2c98 = (code *)0x10e6d9;
    fVar2 = fdb_kvs_close(pfStack_2c88);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_2c98 = (code *)0x10e6eb;
    fVar2 = fdb_kvs_close(pfStack_2c68);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2c98 = (code *)0x10e6fd;
      fVar2 = fdb_close(pfStack_2c80);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2c98 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_2c98 = (code *)0x10e70f;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStackY_2c98 = (code *)0x10e740;
        fprintf(_stderr,pcVar21,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_2c98 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_2c98 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_2c98 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_2c98 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_2c98 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2c98 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_2c98 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2cc0 = doc;
  sStackY_2cb0 = sVar8;
  pcStackY_2ca8 = pcVar21;
  pcStackY_2ca0 = pcVar23;
  pcStackY_2c98 = (code *)pcVar13;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2fc0.block_reusing_threshold = 0x41;
  fStackY_2fc0.num_keeping_headers = 5;
  fdb_open(&pfStackY_30e8,"./staleblktest1",&fStackY_2fc0);
  fdb_kvs_open(pfStackY_30e8,&pfStackY_30f0,"db",&fStackY_30e0);
  iVar4 = 0;
  uVar19 = 0;
  do {
    sprintf(acStackY_30c8,"key%d",uVar19);
    sprintf(acStackY_2ec8,"seqno%d",uVar19);
    pfVar6 = pfStackY_30f0;
    sVar5 = strlen(acStackY_30c8);
    sVar8 = strlen(acStackY_2ec8);
    fdb_set_kv(pfVar6,acStackY_30c8,sVar5,acStackY_2ec8,sVar8);
    if ((int)(uVar19 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_30e8,(int)(uVar19 / 500) * 500 + iVar4 == 0);
    }
    uVar19 = (ulong)((int)uVar19 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010bcbb:
  pcStack_778 = (code *)0x10bcc2;
  verify_minimum_num_keeping_headers_param_test();
LAB_0010bcc2:
  pcVar23 = "val";
  pfVar14 = (fdb_config *)0x147599;
  pcStack_778 = (code *)0x10bcc9;
  verify_minimum_num_keeping_headers_param_test();
  goto LAB_0010bcc9;
LAB_0010bfd7:
  pcStack_950 = (code *)0x10bfde;
  verify_high_num_keeping_headers_param_test();
LAB_0010bfde:
  pcStack_950 = (code *)0x10bfe5;
  verify_high_num_keeping_headers_param_test();
  goto LAB_0010bfe5;
LAB_0010c36c:
  pcStack_c18 = (code *)0x10c373;
  snapshot_before_block_reuse_test();
LAB_0010c373:
  pcStack_c18 = (code *)0x10c37a;
  snapshot_before_block_reuse_test();
LAB_0010c37a:
  pcStack_c18 = (code *)0x10c381;
  snapshot_before_block_reuse_test();
LAB_0010c381:
  pcStack_c18 = (code *)0x10c388;
  snapshot_before_block_reuse_test();
  fVar2 = extraout_EAX_00;
  goto LAB_0010c388;
LAB_0010c694:
  pcStack_de0 = (code *)0x10c69b;
  snapshot_after_block_reuse_test();
LAB_0010c69b:
  pcStack_de0 = (code *)0x10c6a2;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6a2;
LAB_0010c9d3:
  pcStack_f98 = (code *)0x10c9da;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9da:
  pcStack_f98 = (code *)0x10c9e1;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e1:
  pcStack_f98 = (code *)0x10c9e8;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e8:
  pcStack_f98 = (code *)0x10c9ef;
  snapshot_inmem_before_block_reuse_test();
  fVar2 = extraout_EAX_01;
  goto LAB_0010c9ef;
code_r0x0010cc6c:
  keylen = keylen + 0x400;
  if (keylen == 0xfff) goto code_r0x0010cc7c;
  goto LAB_0010cc13;
code_r0x0010cc7c:
  pcStack_1280 = (code *)0x10cc8b;
  fVar2 = fdb_get_file_info(pfStack_1270,&fStack_1200);
  aVar24 = aStack_1260;
  sVar20 = sStack_1268;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d06a;
  handle_00.seqtree = (btree *)&(aStack_1260.seqtree)->vsize;
  sVar7 = (size_t)((int)sStack_1268 + 8);
  if (0xffffff < fStack_1200.file_size) goto code_r0x0010ccb6;
  goto LAB_0010cc04;
LAB_0010d06a:
  pcStack_1280 = (code *)0x10d071;
  variable_value_size_test();
LAB_0010d071:
  pcStack_1280 = (code *)0x10d078;
  variable_value_size_test();
  aVar25 = handle_00;
LAB_0010d078:
  handle_00 = aVar25;
  pcStack_1280 = (code *)0x10d07f;
  variable_value_size_test();
LAB_0010d07f:
  pcStack_1280 = (code *)0x10d086;
  variable_value_size_test();
  sVar20 = keylen;
  aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar13;
  goto LAB_0010d086;
code_r0x0010ccb6:
  pcStack_1280 = (code *)0x10ccbf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_1278.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d08d;
  pcStack_1280 = (code *)0x10ccd4;
  fVar2 = fdb_commit(pfStack_1270,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d092;
  pcStack_1280 = (code *)0x10ccf1;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1278.seqtree,
                            (fdb_kvs_handle **)&aStack_1248.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d099;
  if ((fdb_kvs_handle *)aVar24.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_1238.seqtree = aVar24.seqtree;
    pcVar21 = (char *)0x0;
    aStack_1230 = handle_00;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar24;
      uVar17 = (int)sVar20 + 1;
      pcStack_1280 = (code *)0x10cd43;
      sprintf((char *)&fStack_11b8,"%d_key",(ulong)uVar17);
      sStack_1268 = sVar20;
      aStack_1260 = aVar24;
      if ((int)uVar17 < 2) {
        uVar19 = 0;
      }
      else {
        uVar19 = sVar20 & 0xffffffff;
        pcStack_1280 = (code *)0x10cd65;
        memset(pcVar23,99,uVar19);
      }
      pcVar13 = (char *)aStack_1278;
      pcVar23[uVar19] = '\0';
      pfVar14 = &fStack_11b8;
      pcStack_1280 = (code *)0x10cd81;
      sVar5 = strlen((char *)pfVar14);
      keylen = sVar5 + 1;
      pcStack_1280 = (code *)0x10cd8d;
      sVar5 = strlen(pcVar23);
      pcStack_1280 = (code *)0x10cda2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar13,pfVar14,keylen,pcVar23,sVar5 + 1);
      handle_00 = aStack_1230;
      aVar25 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d078;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_1230.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar24.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar21) {
        pcStack_1280 = (code *)0x10cddc;
        fVar2 = fdb_commit(pfStack_1270,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d07f;
      }
      aVar24.seqtree = (btree *)((long)&aStack_1260.seqtree[-1].aux + 7);
      pcVar21 = (char *)&((btree *)pcVar21)->vsize;
      sVar20 = (size_t)((int)sStack_1268 - 8);
    } while (aStack_1238.seqtree != (btree *)pcVar21);
  }
  pfVar14 = &fStack_11b8;
  pcStack_1280 = (code *)0x10ce11;
  fVar2 = fdb_commit(pfStack_1270,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a0;
  aVar24.seqtree = (btree *)&fStack_11b8;
  pcStack_1280 = (code *)0x10ce37;
  sprintf((char *)aVar24.seqtree,"%d_key",0x200);
  pcStack_1280 = (code *)0x10ce49;
  memset(pcVar23,0x61,0x4fffff);
  pcVar21 = (char *)aStack_1278;
  pcVar23[0x4fffff] = '\0';
  pcStack_1280 = (code *)0x10ce5c;
  sVar5 = strlen((char *)aVar24.seqtree);
  pfVar14 = (fdb_config *)(sVar5 + 1);
  pcStack_1280 = (code *)0x10ce68;
  sVar5 = strlen(pcVar23);
  pcStack_1280 = (code *)0x10ce7d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar21,aVar24.seqtree,(size_t)pfVar14,pcVar23,sVar5 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a7;
  pcStack_1280 = (code *)0x10ce94;
  fVar2 = fdb_commit(pfStack_1270,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ae;
  pcStack_1280 = (code *)0x10ceba;
  sprintf((char *)&fStack_11b8,"%d_key",0x200);
  pcStack_1280 = (code *)0x10cecc;
  memset(pcVar23,0x61,0x1ff);
  pcVar21 = (char *)aStack_1240;
  pcVar23[0x1ff] = '\0';
  pcStack_1280 = (code *)0x10cee0;
  sVar5 = strlen((char *)&fStack_11b8);
  pcStack_1280 = (code *)0x10cef9;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar21,(btree *)&fStack_11b8,sVar5 + 1,&aStack_1250.seqtree,
                     (size_t *)&pkStack_1258);
  aVar25 = aStack_1250;
  aVar24.seqtree = (btree *)&fStack_11b8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b5;
  pcStack_1280 = (code *)0x10cf16;
  iVar4 = bcmp(pcVar23,aStack_1250.seqtree,(size_t)pkStack_1258);
  if (iVar4 != 0) goto LAB_0010d0bc;
  pcStack_1280 = (code *)0x10cf26;
  fVar2 = fdb_free_block(aVar25.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c4;
  aVar25.seqtree = (btree *)&fStack_11b8;
  pcStack_1280 = (code *)0x10cf4c;
  sprintf((char *)aVar25.seqtree,"%d_key",0x800);
  pcStack_1280 = (code *)0x10cf5e;
  memset(pcVar23,0x62,0x7ff);
  pcVar21 = (char *)aStack_1248;
  pcVar23[0x7ff] = '\0';
  pcStack_1280 = (code *)0x10cf72;
  sVar5 = strlen((char *)aVar25.seqtree);
  pcStack_1280 = (code *)0x10cf8b;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar21,aVar25.seqtree,sVar5 + 1,&aStack_1250.seqtree,
                     (size_t *)&pkStack_1258);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0cb;
  pcStack_1280 = (code *)0x10cfa8;
  iVar4 = bcmp(pcVar23,aStack_1250.seqtree,(size_t)pkStack_1258);
  aVar25 = aStack_1250;
  if (iVar4 != 0) goto LAB_0010d0d2;
  pcStack_1280 = (code *)0x10cfb8;
  fVar2 = fdb_free_block(aStack_1250.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0da;
  pcStack_1280 = (code *)0x10cfc8;
  operator_delete__(pcVar23);
  pcStack_1280 = (code *)0x10cfd1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1278.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e1;
  pcStack_1280 = (code *)0x10cfe3;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1240.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e8;
  pcStack_1280 = (code *)0x10cff5;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1248.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ef;
  pcStack_1280 = (code *)0x10d007;
  fVar2 = fdb_close(pfStack_1270);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1280 = (code *)0x10d014;
    fdb_shutdown();
    pcStack_1280 = (code *)0x10d019;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pcStack_1280 = (code *)0x10d04a;
    fprintf(_stderr,pcVar21,"variable value size test");
    return;
  }
  goto LAB_0010d0f6;
LAB_0010d44c:
  pcStack_1958 = (code *)0x10d453;
  rollback_with_num_keeping_headers();
LAB_0010d453:
  pcStack_1958 = (code *)0x10d45a;
  rollback_with_num_keeping_headers();
LAB_0010d45a:
  pcStack_1958 = (code *)0x10d461;
  rollback_with_num_keeping_headers();
  goto LAB_0010d461;
LAB_0010d9ef:
  pcStack_1e40 = (code *)0x10d9f6;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9f6:
  pcStack_1e40 = (code *)0x10d9fd;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9fd:
  pcStack_1e40 = (code *)0x10da04;
  crash_and_recover_with_num_keeping_test();
LAB_0010da04:
  pcStack_1e40 = (code *)0x10da0b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da0b:
  pcStack_1e40 = (code *)0x10da12;
  crash_and_recover_with_num_keeping_test();
LAB_0010da12:
  pcStack_1e40 = (code *)0x10da19;
  crash_and_recover_with_num_keeping_test();
LAB_0010da19:
  pcStack_1e40 = (code *)0x10da20;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da20;
LAB_0010de20:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  pfVar9 = pfVar10;
  pfStack_22e8 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar10 = pfVar9;
  goto LAB_0010de3c;
LAB_0010e2ca:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_2c98 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_2c98 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_2c98 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_2c98 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void reuse_with_snapshot_test() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    void *rvalue;
    size_t rvalue_len;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 10;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 2*num_keeping_headers
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        sprintf(bodybuf, "orig_body%d", i+1);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        fillstr(keybuf, 'r', kv);
        fillstr(bodybuf, 'y', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // open snapshot
    status = fdb_snapshot_open(db, &snap_db, 8);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // write until blocks are no longer being reused
    i = 0;
    do {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'z', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        sb_decision = sb_check_block_reusing(db);
        i++;
    } while (sb_decision != SBD_NONE);

    // delete original keys
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    fillstr(keybuf, 'k', kv);
    sprintf(bodybuf, "orig_body%d", 8);

    // check key does not exist in main kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // check still exists in snapshot data
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, bodybuf, rvalue_len);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reuse with snapshot test");
}